

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersector1<4>::
     occluded_n<embree::avx::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  bool bVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  bool bVar59;
  bool bVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  ulong uVar64;
  long lVar65;
  uint uVar66;
  ulong uVar68;
  long lVar69;
  undefined1 auVar70 [8];
  float fVar71;
  float fVar95;
  float fVar96;
  vint4 bi_2;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar97;
  vint4 bi_1;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  vint4 bi;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar147;
  float fVar171;
  float fVar173;
  vint4 ai_1;
  undefined1 auVar149 [16];
  float fVar175;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar148;
  float fVar172;
  float fVar174;
  float fVar176;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar177;
  float fVar178;
  float fVar195;
  float fVar197;
  vint4 ai_2;
  undefined1 auVar179 [16];
  float fVar199;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar196;
  float fVar198;
  float fVar200;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar201;
  float fVar215;
  float fVar216;
  undefined1 auVar202 [16];
  float fVar217;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar230;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar224 [16];
  float fVar231;
  float fVar232;
  undefined1 auVar229 [32];
  vint4 ai;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [32];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [32];
  float fVar298;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar308;
  float fVar309;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar310;
  undefined1 auVar307 [16];
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  float fVar323;
  float fVar324;
  undefined1 auVar322 [32];
  float fVar325;
  float fVar330;
  float fVar331;
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  vfloat4 a0;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_4d9;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  int local_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 auStack_438 [16];
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 auStack_3d8 [16];
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 auStack_398 [16];
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  ulong local_2e0;
  Precalculations *local_2d8;
  Primitive *local_2d0;
  RTCFilterFunctionNArguments local_2c8;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  uint auStack_268 [4];
  undefined8 local_258;
  undefined4 local_250;
  undefined8 local_24c;
  undefined4 local_244;
  uint local_240;
  uint local_23c;
  uint local_238;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [32];
  float afStack_178 [8];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar67;
  undefined1 auVar170 [32];
  undefined1 auVar337 [32];
  
  PVar7 = prim[1];
  uVar64 = (ulong)(byte)PVar7;
  lVar65 = uVar64 * 0x25;
  fVar97 = *(float *)(prim + lVar65 + 0x12);
  auVar113 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar65 + 6));
  auVar233._0_4_ = fVar97 * (ray->dir).field_0.m128[0];
  auVar233._4_4_ = fVar97 * (ray->dir).field_0.m128[1];
  auVar233._8_4_ = fVar97 * (ray->dir).field_0.m128[2];
  auVar233._12_4_ = fVar97 * (ray->dir).field_0.m128[3];
  auVar124._0_4_ = fVar97 * auVar113._0_4_;
  auVar124._4_4_ = fVar97 * auVar113._4_4_;
  auVar124._8_4_ = fVar97 * auVar113._8_4_;
  auVar124._12_4_ = fVar97 * auVar113._12_4_;
  auVar113 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 4 + 6)));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar283 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 5 + 6)));
  auVar283 = vcvtdq2ps_avx(auVar283);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 6 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar253 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0xf + 6)));
  auVar253 = vcvtdq2ps_avx(auVar253);
  auVar213 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar213 = vcvtdq2ps_avx(auVar213);
  auVar133 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar64 + 6)));
  auVar112 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1a + 6)));
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar163 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1b + 6)));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1c + 6)));
  auVar163 = vcvtdq2ps_avx(auVar163);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar137 = vshufps_avx(auVar233,auVar233,0);
  auVar15 = vshufps_avx(auVar233,auVar233,0x55);
  auVar16 = vshufps_avx(auVar233,auVar233,0xaa);
  fVar97 = auVar16._0_4_;
  fVar71 = auVar16._4_4_;
  fVar95 = auVar16._8_4_;
  fVar96 = auVar16._12_4_;
  fVar177 = auVar15._0_4_;
  fVar195 = auVar15._4_4_;
  fVar197 = auVar15._8_4_;
  fVar199 = auVar15._12_4_;
  fVar147 = auVar137._0_4_;
  fVar171 = auVar137._4_4_;
  fVar173 = auVar137._8_4_;
  fVar175 = auVar137._12_4_;
  auVar303._0_4_ = fVar147 * auVar113._0_4_ + fVar177 * auVar283._0_4_ + fVar97 * auVar14._0_4_;
  auVar303._4_4_ = fVar171 * auVar113._4_4_ + fVar195 * auVar283._4_4_ + fVar71 * auVar14._4_4_;
  auVar303._8_4_ = fVar173 * auVar113._8_4_ + fVar197 * auVar283._8_4_ + fVar95 * auVar14._8_4_;
  auVar303._12_4_ = fVar175 * auVar113._12_4_ + fVar199 * auVar283._12_4_ + fVar96 * auVar14._12_4_;
  auVar318._0_4_ = fVar147 * auVar253._0_4_ + fVar177 * auVar213._0_4_ + auVar133._0_4_ * fVar97;
  auVar318._4_4_ = fVar171 * auVar253._4_4_ + fVar195 * auVar213._4_4_ + auVar133._4_4_ * fVar71;
  auVar318._8_4_ = fVar173 * auVar253._8_4_ + fVar197 * auVar213._8_4_ + auVar133._8_4_ * fVar95;
  auVar318._12_4_ = fVar175 * auVar253._12_4_ + fVar199 * auVar213._12_4_ + auVar133._12_4_ * fVar96
  ;
  auVar234._0_4_ = fVar147 * auVar112._0_4_ + fVar177 * auVar163._0_4_ + auVar88._0_4_ * fVar97;
  auVar234._4_4_ = fVar171 * auVar112._4_4_ + fVar195 * auVar163._4_4_ + auVar88._4_4_ * fVar71;
  auVar234._8_4_ = fVar173 * auVar112._8_4_ + fVar197 * auVar163._8_4_ + auVar88._8_4_ * fVar95;
  auVar234._12_4_ = fVar175 * auVar112._12_4_ + fVar199 * auVar163._12_4_ + auVar88._12_4_ * fVar96;
  auVar137 = vshufps_avx(auVar124,auVar124,0);
  auVar15 = vshufps_avx(auVar124,auVar124,0x55);
  auVar16 = vshufps_avx(auVar124,auVar124,0xaa);
  fVar97 = auVar16._0_4_;
  fVar71 = auVar16._4_4_;
  fVar95 = auVar16._8_4_;
  fVar96 = auVar16._12_4_;
  fVar177 = auVar15._0_4_;
  fVar195 = auVar15._4_4_;
  fVar197 = auVar15._8_4_;
  fVar199 = auVar15._12_4_;
  fVar147 = auVar137._0_4_;
  fVar171 = auVar137._4_4_;
  fVar173 = auVar137._8_4_;
  fVar175 = auVar137._12_4_;
  auVar125._0_4_ = fVar147 * auVar113._0_4_ + fVar177 * auVar283._0_4_ + fVar97 * auVar14._0_4_;
  auVar125._4_4_ = fVar171 * auVar113._4_4_ + fVar195 * auVar283._4_4_ + fVar71 * auVar14._4_4_;
  auVar125._8_4_ = fVar173 * auVar113._8_4_ + fVar197 * auVar283._8_4_ + fVar95 * auVar14._8_4_;
  auVar125._12_4_ = fVar175 * auVar113._12_4_ + fVar199 * auVar283._12_4_ + fVar96 * auVar14._12_4_;
  auVar98._0_4_ = fVar147 * auVar253._0_4_ + auVar133._0_4_ * fVar97 + fVar177 * auVar213._0_4_;
  auVar98._4_4_ = fVar171 * auVar253._4_4_ + auVar133._4_4_ * fVar71 + fVar195 * auVar213._4_4_;
  auVar98._8_4_ = fVar173 * auVar253._8_4_ + auVar133._8_4_ * fVar95 + fVar197 * auVar213._8_4_;
  auVar98._12_4_ = fVar175 * auVar253._12_4_ + auVar133._12_4_ * fVar96 + fVar199 * auVar213._12_4_;
  auVar72._0_4_ = fVar147 * auVar112._0_4_ + fVar177 * auVar163._0_4_ + auVar88._0_4_ * fVar97;
  auVar72._4_4_ = fVar171 * auVar112._4_4_ + fVar195 * auVar163._4_4_ + auVar88._4_4_ * fVar71;
  auVar72._8_4_ = fVar173 * auVar112._8_4_ + fVar197 * auVar163._8_4_ + auVar88._8_4_ * fVar95;
  auVar72._12_4_ = fVar175 * auVar112._12_4_ + fVar199 * auVar163._12_4_ + auVar88._12_4_ * fVar96;
  auVar218._8_4_ = 0x7fffffff;
  auVar218._0_8_ = 0x7fffffff7fffffff;
  auVar218._12_4_ = 0x7fffffff;
  auVar113 = vandps_avx(auVar303,auVar218);
  auVar179._8_4_ = 0x219392ef;
  auVar179._0_8_ = 0x219392ef219392ef;
  auVar179._12_4_ = 0x219392ef;
  auVar113 = vcmpps_avx(auVar113,auVar179,1);
  auVar283 = vblendvps_avx(auVar303,auVar179,auVar113);
  auVar113 = vandps_avx(auVar318,auVar218);
  auVar113 = vcmpps_avx(auVar113,auVar179,1);
  auVar14 = vblendvps_avx(auVar318,auVar179,auVar113);
  auVar113 = vandps_avx(auVar234,auVar218);
  auVar113 = vcmpps_avx(auVar113,auVar179,1);
  auVar113 = vblendvps_avx(auVar234,auVar179,auVar113);
  auVar253 = vrcpps_avx(auVar283);
  fVar147 = auVar253._0_4_;
  auVar149._0_4_ = fVar147 * auVar283._0_4_;
  fVar171 = auVar253._4_4_;
  auVar149._4_4_ = fVar171 * auVar283._4_4_;
  fVar173 = auVar253._8_4_;
  auVar149._8_4_ = fVar173 * auVar283._8_4_;
  fVar175 = auVar253._12_4_;
  auVar149._12_4_ = fVar175 * auVar283._12_4_;
  auVar235._8_4_ = 0x3f800000;
  auVar235._0_8_ = &DAT_3f8000003f800000;
  auVar235._12_4_ = 0x3f800000;
  auVar283 = vsubps_avx(auVar235,auVar149);
  fVar147 = fVar147 + fVar147 * auVar283._0_4_;
  fVar171 = fVar171 + fVar171 * auVar283._4_4_;
  fVar173 = fVar173 + fVar173 * auVar283._8_4_;
  fVar175 = fVar175 + fVar175 * auVar283._12_4_;
  auVar283 = vrcpps_avx(auVar14);
  fVar177 = auVar283._0_4_;
  auVar202._0_4_ = fVar177 * auVar14._0_4_;
  fVar195 = auVar283._4_4_;
  auVar202._4_4_ = fVar195 * auVar14._4_4_;
  fVar197 = auVar283._8_4_;
  auVar202._8_4_ = fVar197 * auVar14._8_4_;
  fVar199 = auVar283._12_4_;
  auVar202._12_4_ = fVar199 * auVar14._12_4_;
  auVar283 = vsubps_avx(auVar235,auVar202);
  fVar177 = fVar177 + fVar177 * auVar283._0_4_;
  fVar195 = fVar195 + fVar195 * auVar283._4_4_;
  fVar197 = fVar197 + fVar197 * auVar283._8_4_;
  fVar199 = fVar199 + fVar199 * auVar283._12_4_;
  auVar283 = vrcpps_avx(auVar113);
  fVar201 = auVar283._0_4_;
  auVar219._0_4_ = fVar201 * auVar113._0_4_;
  fVar215 = auVar283._4_4_;
  auVar219._4_4_ = fVar215 * auVar113._4_4_;
  fVar216 = auVar283._8_4_;
  auVar219._8_4_ = fVar216 * auVar113._8_4_;
  fVar217 = auVar283._12_4_;
  auVar219._12_4_ = fVar217 * auVar113._12_4_;
  auVar113 = vsubps_avx(auVar235,auVar219);
  fVar201 = fVar201 + fVar201 * auVar113._0_4_;
  fVar215 = fVar215 + fVar215 * auVar113._4_4_;
  fVar216 = fVar216 + fVar216 * auVar113._8_4_;
  fVar217 = fVar217 + fVar217 * auVar113._12_4_;
  auVar113 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar65 + 0x16)) *
                           *(float *)(prim + lVar65 + 0x1a)));
  auVar14 = vshufps_avx(auVar113,auVar113,0);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar64 * 7 + 6);
  auVar113 = vpmovsxwd_avx(auVar113);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar283._8_8_ = 0;
  auVar283._0_8_ = *(ulong *)(prim + uVar64 * 0xb + 6);
  auVar283 = vpmovsxwd_avx(auVar283);
  auVar283 = vcvtdq2ps_avx(auVar283);
  auVar283 = vsubps_avx(auVar283,auVar113);
  fVar97 = auVar14._0_4_;
  fVar71 = auVar14._4_4_;
  fVar95 = auVar14._8_4_;
  fVar96 = auVar14._12_4_;
  auVar236._0_4_ = auVar283._0_4_ * fVar97 + auVar113._0_4_;
  auVar236._4_4_ = auVar283._4_4_ * fVar71 + auVar113._4_4_;
  auVar236._8_4_ = auVar283._8_4_ * fVar95 + auVar113._8_4_;
  auVar236._12_4_ = auVar283._12_4_ * fVar96 + auVar113._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar64 * 9 + 6);
  auVar113 = vpmovsxwd_avx(auVar14);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar253._8_8_ = 0;
  auVar253._0_8_ = *(ulong *)(prim + uVar64 * 0xd + 6);
  auVar283 = vpmovsxwd_avx(auVar253);
  auVar283 = vcvtdq2ps_avx(auVar283);
  auVar283 = vsubps_avx(auVar283,auVar113);
  auVar246._0_4_ = auVar283._0_4_ * fVar97 + auVar113._0_4_;
  auVar246._4_4_ = auVar283._4_4_ * fVar71 + auVar113._4_4_;
  auVar246._8_4_ = auVar283._8_4_ * fVar95 + auVar113._8_4_;
  auVar246._12_4_ = auVar283._12_4_ * fVar96 + auVar113._12_4_;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = *(ulong *)(prim + uVar64 * 0x12 + 6);
  auVar113 = vpmovsxwd_avx(auVar213);
  auVar113 = vcvtdq2ps_avx(auVar113);
  uVar68 = (ulong)(uint)((int)(uVar64 * 5) << 2);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = *(ulong *)(prim + uVar64 * 2 + uVar68 + 6);
  auVar283 = vpmovsxwd_avx(auVar133);
  auVar283 = vcvtdq2ps_avx(auVar283);
  auVar283 = vsubps_avx(auVar283,auVar113);
  auVar266._0_4_ = auVar283._0_4_ * fVar97 + auVar113._0_4_;
  auVar266._4_4_ = auVar283._4_4_ * fVar71 + auVar113._4_4_;
  auVar266._8_4_ = auVar283._8_4_ * fVar95 + auVar113._8_4_;
  auVar266._12_4_ = auVar283._12_4_ * fVar96 + auVar113._12_4_;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + uVar68 + 6);
  auVar113 = vpmovsxwd_avx(auVar112);
  auVar163._8_8_ = 0;
  auVar163._0_8_ = *(ulong *)(prim + uVar64 * 0x18 + 6);
  auVar283 = vpmovsxwd_avx(auVar163);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar283 = vcvtdq2ps_avx(auVar283);
  auVar283 = vsubps_avx(auVar283,auVar113);
  auVar278._0_4_ = auVar283._0_4_ * fVar97 + auVar113._0_4_;
  auVar278._4_4_ = auVar283._4_4_ * fVar71 + auVar113._4_4_;
  auVar278._8_4_ = auVar283._8_4_ * fVar95 + auVar113._8_4_;
  auVar278._12_4_ = auVar283._12_4_ * fVar96 + auVar113._12_4_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar64 * 0x1d + 6);
  auVar113 = vpmovsxwd_avx(auVar88);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = *(ulong *)(prim + uVar64 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar283 = vpmovsxwd_avx(auVar137);
  auVar283 = vcvtdq2ps_avx(auVar283);
  auVar14 = vsubps_avx(auVar283,auVar113);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar64) + 6);
  auVar283 = vpmovsxwd_avx(auVar15);
  auVar291._0_4_ = auVar14._0_4_ * fVar97 + auVar113._0_4_;
  auVar291._4_4_ = auVar14._4_4_ * fVar71 + auVar113._4_4_;
  auVar291._8_4_ = auVar14._8_4_ * fVar95 + auVar113._8_4_;
  auVar291._12_4_ = auVar14._12_4_ * fVar96 + auVar113._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar64 * 0x23 + 6);
  auVar14 = vpmovsxwd_avx(auVar16);
  auVar113 = vcvtdq2ps_avx(auVar283);
  auVar283 = vcvtdq2ps_avx(auVar14);
  auVar283 = vsubps_avx(auVar283,auVar113);
  auVar220._0_4_ = auVar113._0_4_ + auVar283._0_4_ * fVar97;
  auVar220._4_4_ = auVar113._4_4_ + auVar283._4_4_ * fVar71;
  auVar220._8_4_ = auVar113._8_4_ + auVar283._8_4_ * fVar95;
  auVar220._12_4_ = auVar113._12_4_ + auVar283._12_4_ * fVar96;
  auVar113 = vsubps_avx(auVar236,auVar125);
  auVar237._0_4_ = fVar147 * auVar113._0_4_;
  auVar237._4_4_ = fVar171 * auVar113._4_4_;
  auVar237._8_4_ = fVar173 * auVar113._8_4_;
  auVar237._12_4_ = fVar175 * auVar113._12_4_;
  auVar113 = vsubps_avx(auVar246,auVar125);
  auVar126._0_4_ = fVar147 * auVar113._0_4_;
  auVar126._4_4_ = fVar171 * auVar113._4_4_;
  auVar126._8_4_ = fVar173 * auVar113._8_4_;
  auVar126._12_4_ = fVar175 * auVar113._12_4_;
  auVar113 = vsubps_avx(auVar266,auVar98);
  auVar150._0_4_ = fVar177 * auVar113._0_4_;
  auVar150._4_4_ = fVar195 * auVar113._4_4_;
  auVar150._8_4_ = fVar197 * auVar113._8_4_;
  auVar150._12_4_ = fVar199 * auVar113._12_4_;
  auVar113 = vsubps_avx(auVar278,auVar98);
  auVar99._0_4_ = fVar177 * auVar113._0_4_;
  auVar99._4_4_ = fVar195 * auVar113._4_4_;
  auVar99._8_4_ = fVar197 * auVar113._8_4_;
  auVar99._12_4_ = fVar199 * auVar113._12_4_;
  auVar113 = vsubps_avx(auVar291,auVar72);
  auVar180._0_4_ = fVar201 * auVar113._0_4_;
  auVar180._4_4_ = fVar215 * auVar113._4_4_;
  auVar180._8_4_ = fVar216 * auVar113._8_4_;
  auVar180._12_4_ = fVar217 * auVar113._12_4_;
  auVar113 = vsubps_avx(auVar220,auVar72);
  auVar73._0_4_ = fVar201 * auVar113._0_4_;
  auVar73._4_4_ = fVar215 * auVar113._4_4_;
  auVar73._8_4_ = fVar216 * auVar113._8_4_;
  auVar73._12_4_ = fVar217 * auVar113._12_4_;
  auVar113 = vpminsd_avx(auVar237,auVar126);
  auVar283 = vpminsd_avx(auVar150,auVar99);
  auVar113 = vmaxps_avx(auVar113,auVar283);
  auVar283 = vpminsd_avx(auVar180,auVar73);
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar247._4_4_ = uVar4;
  auVar247._0_4_ = uVar4;
  auVar247._8_4_ = uVar4;
  auVar247._12_4_ = uVar4;
  auVar283 = vmaxps_avx(auVar283,auVar247);
  auVar113 = vmaxps_avx(auVar113,auVar283);
  local_1e8._0_4_ = auVar113._0_4_ * 0.99999964;
  local_1e8._4_4_ = auVar113._4_4_ * 0.99999964;
  local_1e8._8_4_ = auVar113._8_4_ * 0.99999964;
  local_1e8._12_4_ = auVar113._12_4_ * 0.99999964;
  auVar113 = vpmaxsd_avx(auVar237,auVar126);
  auVar283 = vpmaxsd_avx(auVar150,auVar99);
  auVar113 = vminps_avx(auVar113,auVar283);
  auVar283 = vpmaxsd_avx(auVar180,auVar73);
  fVar97 = ray->tfar;
  auVar127._4_4_ = fVar97;
  auVar127._0_4_ = fVar97;
  auVar127._8_4_ = fVar97;
  auVar127._12_4_ = fVar97;
  auVar283 = vminps_avx(auVar283,auVar127);
  auVar113 = vminps_avx(auVar113,auVar283);
  auVar74._0_4_ = auVar113._0_4_ * 1.0000004;
  auVar74._4_4_ = auVar113._4_4_ * 1.0000004;
  auVar74._8_4_ = auVar113._8_4_ * 1.0000004;
  auVar74._12_4_ = auVar113._12_4_ * 1.0000004;
  auVar113 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar283 = vpcmpgtd_avx(auVar113,_DAT_01ff0cf0);
  auVar113 = vcmpps_avx(local_1e8,auVar74,2);
  auVar113 = vandps_avx(auVar113,auVar283);
  uVar61 = vmovmskps_avx(auVar113);
  local_4d9 = uVar61 != 0;
  if (uVar61 == 0) {
    return local_4d9;
  }
  auVar91._16_16_ = mm_lookupmask_ps._240_16_;
  auVar91._0_16_ = mm_lookupmask_ps._240_16_;
  uVar61 = uVar61 & 0xff;
  local_198 = vblendps_avx(auVar91,ZEXT832(0) << 0x20,0x80);
  local_2d8 = pre;
  local_2d0 = prim;
LAB_0108b6a7:
  auVar70 = (undefined1  [8])(ulong)uVar61;
  lVar65 = 0;
  if (auVar70 != (undefined1  [8])0x0) {
    for (; (uVar61 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
    }
  }
  uVar63 = *(uint *)(local_2d0 + 2);
  local_2e0 = (ulong)*(uint *)(local_2d0 + lVar65 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar63].ptr;
  fVar97 = (pGVar8->time_range).lower;
  fVar97 = pGVar8->fnumTimeSegments *
           (((ray->dir).field_0.m128[3] - fVar97) / ((pGVar8->time_range).upper - fVar97));
  auVar113 = vroundss_avx(ZEXT416((uint)fVar97),ZEXT416((uint)fVar97),9);
  auVar113 = vminss_avx(auVar113,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar283 = vmaxss_avx(ZEXT816(0) << 0x20,auVar113);
  uVar64 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           local_2e0 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar69 = (long)(int)auVar283._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar69);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar69);
  pfVar3 = (float *)(lVar10 + lVar11 * uVar64);
  fVar71 = *pfVar3;
  fVar95 = pfVar3[1];
  fVar96 = pfVar3[2];
  fVar147 = pfVar3[3];
  lVar65 = uVar64 + 1;
  pfVar3 = (float *)(lVar10 + lVar11 * lVar65);
  fVar171 = *pfVar3;
  fVar173 = pfVar3[1];
  fVar175 = pfVar3[2];
  fVar177 = pfVar3[3];
  lVar1 = uVar64 + 2;
  pfVar3 = (float *)(lVar10 + lVar11 * lVar1);
  fVar195 = *pfVar3;
  fVar197 = pfVar3[1];
  fVar199 = pfVar3[2];
  fVar201 = pfVar3[3];
  lVar2 = uVar64 + 3;
  pfVar3 = (float *)(lVar10 + lVar11 * lVar2);
  fVar215 = *pfVar3;
  fVar216 = pfVar3[1];
  fVar217 = pfVar3[2];
  fVar298 = pfVar3[3];
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar69);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar69);
  auVar113 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar64);
  pfVar3 = (float *)(lVar11 + lVar12 * lVar65);
  fVar148 = *pfVar3;
  fVar172 = pfVar3[1];
  fVar174 = pfVar3[2];
  fVar176 = pfVar3[3];
  pfVar3 = (float *)(lVar11 + lVar12 * lVar1);
  fVar178 = *pfVar3;
  fVar196 = pfVar3[1];
  fVar198 = pfVar3[2];
  fVar200 = pfVar3[3];
  fVar97 = fVar97 - auVar283._0_4_;
  pfVar3 = (float *)(lVar11 + lVar12 * lVar2);
  fVar299 = *pfVar3;
  fVar300 = pfVar3[1];
  fVar301 = pfVar3[2];
  fVar230 = pfVar3[3];
  auVar75._0_4_ = fVar171 * 0.0 + fVar195 * 0.5 + fVar215 * 0.0;
  auVar75._4_4_ = fVar173 * 0.0 + fVar197 * 0.5 + fVar216 * 0.0;
  auVar75._8_4_ = fVar175 * 0.0 + fVar199 * 0.5 + fVar217 * 0.0;
  auVar75._12_4_ = fVar177 * 0.0 + fVar201 * 0.5 + fVar298 * 0.0;
  auVar128._0_4_ = fVar71 * 0.5;
  auVar128._4_4_ = fVar95 * 0.5;
  auVar128._8_4_ = fVar96 * 0.5;
  auVar128._12_4_ = fVar147 * 0.5;
  auVar163 = vsubps_avx(auVar75,auVar128);
  auVar76._0_4_ = fVar148 * 0.0 + fVar178 * 0.5 + fVar299 * 0.0;
  auVar76._4_4_ = fVar172 * 0.0 + fVar196 * 0.5 + fVar300 * 0.0;
  auVar76._8_4_ = fVar174 * 0.0 + fVar198 * 0.5 + fVar301 * 0.0;
  auVar76._12_4_ = fVar176 * 0.0 + fVar200 * 0.5 + fVar230 * 0.0;
  fVar302 = auVar113._0_4_;
  auVar326._0_4_ = fVar302 * 0.5;
  fVar231 = auVar113._4_4_;
  auVar326._4_4_ = fVar231 * 0.5;
  fVar308 = auVar113._8_4_;
  auVar326._8_4_ = fVar308 * 0.5;
  fVar232 = auVar113._12_4_;
  auVar326._12_4_ = fVar232 * 0.5;
  auVar253 = vsubps_avx(auVar76,auVar326);
  local_498._0_4_ = fVar71 * -0.0 + fVar195 * 0.0 + fVar215 * -0.0 + fVar171;
  local_498._4_4_ = fVar95 * -0.0 + fVar197 * 0.0 + fVar216 * -0.0 + fVar173;
  fStack_490 = fVar96 * -0.0 + fVar199 * 0.0 + fVar217 * -0.0 + fVar175;
  fStack_48c = fVar147 * -0.0 + fVar201 * 0.0 + fVar298 * -0.0 + fVar177;
  local_428._0_4_ = fVar71 * -0.0 + fVar171 * 0.0 + fVar195 + fVar215 * -0.0;
  local_428._4_4_ = fVar95 * -0.0 + fVar173 * 0.0 + fVar197 + fVar216 * -0.0;
  fStack_420 = fVar96 * -0.0 + fVar175 * 0.0 + fVar199 + fVar217 * -0.0;
  fStack_41c = fVar147 * -0.0 + fVar177 * 0.0 + fVar201 + fVar298 * -0.0;
  auVar248._0_4_ = fVar195 * 0.0 + fVar215 * 0.5;
  auVar248._4_4_ = fVar197 * 0.0 + fVar216 * 0.5;
  auVar248._8_4_ = fVar199 * 0.0 + fVar217 * 0.5;
  auVar248._12_4_ = fVar201 * 0.0 + fVar298 * 0.5;
  auVar181._0_4_ = fVar171 * 0.5;
  auVar181._4_4_ = fVar173 * 0.5;
  auVar181._8_4_ = fVar175 * 0.5;
  auVar181._12_4_ = fVar177 * 0.5;
  auVar113 = vsubps_avx(auVar248,auVar181);
  auVar332._0_4_ = fVar302 * -0.0 + fVar178 * 0.0 + fVar299 * -0.0 + fVar148;
  auVar332._4_4_ = fVar231 * -0.0 + fVar196 * 0.0 + fVar300 * -0.0 + fVar172;
  auVar332._8_4_ = fVar308 * -0.0 + fVar198 * 0.0 + fVar301 * -0.0 + fVar174;
  auVar332._12_4_ = fVar232 * -0.0 + fVar200 * 0.0 + fVar230 * -0.0 + fVar176;
  auVar267._0_4_ = fVar71 * 0.0 + auVar113._0_4_;
  auVar267._4_4_ = fVar95 * 0.0 + auVar113._4_4_;
  auVar267._8_4_ = fVar96 * 0.0 + auVar113._8_4_;
  auVar267._12_4_ = fVar147 * 0.0 + auVar113._12_4_;
  auVar151._0_4_ = fVar302 * -0.0 + fVar148 * 0.0 + fVar178 + fVar299 * -0.0;
  auVar151._4_4_ = fVar231 * -0.0 + fVar172 * 0.0 + fVar196 + fVar300 * -0.0;
  auVar151._8_4_ = fVar308 * -0.0 + fVar174 * 0.0 + fVar198 + fVar301 * -0.0;
  auVar151._12_4_ = fVar232 * -0.0 + fVar176 * 0.0 + fVar200 + fVar230 * -0.0;
  auVar182._0_4_ = fVar178 * 0.0 + fVar299 * 0.5;
  auVar182._4_4_ = fVar196 * 0.0 + fVar300 * 0.5;
  auVar182._8_4_ = fVar198 * 0.0 + fVar301 * 0.5;
  auVar182._12_4_ = fVar200 * 0.0 + fVar230 * 0.5;
  auVar238._0_4_ = fVar148 * 0.5;
  auVar238._4_4_ = fVar172 * 0.5;
  auVar238._8_4_ = fVar174 * 0.5;
  auVar238._12_4_ = fVar176 * 0.5;
  auVar113 = vsubps_avx(auVar182,auVar238);
  auVar183._0_4_ = fVar302 * 0.0 + auVar113._0_4_;
  auVar183._4_4_ = fVar231 * 0.0 + auVar113._4_4_;
  auVar183._8_4_ = fVar308 * 0.0 + auVar113._8_4_;
  auVar183._12_4_ = fVar232 * 0.0 + auVar113._12_4_;
  auVar113 = vshufps_avx(auVar163,auVar163,0xc9);
  auVar283 = vshufps_avx(auVar332,auVar332,0xc9);
  fVar309 = auVar163._0_4_;
  auVar203._0_4_ = fVar309 * auVar283._0_4_;
  fVar310 = auVar163._4_4_;
  auVar203._4_4_ = fVar310 * auVar283._4_4_;
  fVar311 = auVar163._8_4_;
  auVar203._8_4_ = fVar311 * auVar283._8_4_;
  fVar313 = auVar163._12_4_;
  auVar203._12_4_ = fVar313 * auVar283._12_4_;
  auVar249._0_4_ = auVar332._0_4_ * auVar113._0_4_;
  auVar249._4_4_ = auVar332._4_4_ * auVar113._4_4_;
  auVar249._8_4_ = auVar332._8_4_ * auVar113._8_4_;
  auVar249._12_4_ = auVar332._12_4_ * auVar113._12_4_;
  auVar283 = vsubps_avx(auVar249,auVar203);
  auVar14 = vshufps_avx(auVar283,auVar283,0xc9);
  auVar283 = vshufps_avx(auVar253,auVar253,0xc9);
  auVar250._0_4_ = auVar283._0_4_ * fVar309;
  auVar250._4_4_ = auVar283._4_4_ * fVar310;
  auVar250._8_4_ = auVar283._8_4_ * fVar311;
  auVar250._12_4_ = auVar283._12_4_ * fVar313;
  auVar77._0_4_ = auVar113._0_4_ * auVar253._0_4_;
  auVar77._4_4_ = auVar113._4_4_ * auVar253._4_4_;
  auVar77._8_4_ = auVar113._8_4_ * auVar253._8_4_;
  auVar77._12_4_ = auVar113._12_4_ * auVar253._12_4_;
  auVar113 = vsubps_avx(auVar77,auVar250);
  auVar253 = vshufps_avx(auVar113,auVar113,0xc9);
  auVar113 = vshufps_avx(auVar267,auVar267,0xc9);
  auVar283 = vshufps_avx(auVar151,auVar151,0xc9);
  auVar251._0_4_ = auVar267._0_4_ * auVar283._0_4_;
  auVar251._4_4_ = auVar267._4_4_ * auVar283._4_4_;
  auVar251._8_4_ = auVar267._8_4_ * auVar283._8_4_;
  auVar251._12_4_ = auVar267._12_4_ * auVar283._12_4_;
  auVar152._0_4_ = auVar113._0_4_ * auVar151._0_4_;
  auVar152._4_4_ = auVar113._4_4_ * auVar151._4_4_;
  auVar152._8_4_ = auVar113._8_4_ * auVar151._8_4_;
  auVar152._12_4_ = auVar113._12_4_ * auVar151._12_4_;
  auVar283 = vsubps_avx(auVar152,auVar251);
  auVar213 = vshufps_avx(auVar283,auVar283,0xc9);
  auVar283 = vshufps_avx(auVar183,auVar183,0xc9);
  auVar252._0_4_ = auVar267._0_4_ * auVar283._0_4_;
  auVar252._4_4_ = auVar267._4_4_ * auVar283._4_4_;
  auVar252._8_4_ = auVar267._8_4_ * auVar283._8_4_;
  auVar252._12_4_ = auVar267._12_4_ * auVar283._12_4_;
  auVar184._0_4_ = auVar113._0_4_ * auVar183._0_4_;
  auVar184._4_4_ = auVar113._4_4_ * auVar183._4_4_;
  auVar184._8_4_ = auVar113._8_4_ * auVar183._8_4_;
  auVar184._12_4_ = auVar113._12_4_ * auVar183._12_4_;
  auVar113 = vsubps_avx(auVar184,auVar252);
  auVar133 = vshufps_avx(auVar113,auVar113,0xc9);
  auVar113 = vdpps_avx(auVar14,auVar14,0x7f);
  fVar95 = auVar113._0_4_;
  auVar137 = ZEXT416((uint)fVar95);
  auVar283 = vrsqrtss_avx(auVar137,auVar137);
  fVar71 = auVar283._0_4_;
  auVar283 = vdpps_avx(auVar14,auVar253,0x7f);
  auVar112 = ZEXT416((uint)(fVar71 * 1.5 - fVar95 * 0.5 * fVar71 * fVar71 * fVar71));
  auVar112 = vshufps_avx(auVar112,auVar112,0);
  fVar178 = auVar112._0_4_ * auVar14._0_4_;
  fVar196 = auVar112._4_4_ * auVar14._4_4_;
  fVar198 = auVar112._8_4_ * auVar14._8_4_;
  fVar200 = auVar112._12_4_ * auVar14._12_4_;
  auVar113 = vshufps_avx(auVar113,auVar113,0);
  auVar78._0_4_ = auVar113._0_4_ * auVar253._0_4_;
  auVar78._4_4_ = auVar113._4_4_ * auVar253._4_4_;
  auVar78._8_4_ = auVar113._8_4_ * auVar253._8_4_;
  auVar78._12_4_ = auVar113._12_4_ * auVar253._12_4_;
  auVar113 = vshufps_avx(auVar283,auVar283,0);
  auVar204._0_4_ = auVar113._0_4_ * auVar14._0_4_;
  auVar204._4_4_ = auVar113._4_4_ * auVar14._4_4_;
  auVar204._8_4_ = auVar113._8_4_ * auVar14._8_4_;
  auVar204._12_4_ = auVar113._12_4_ * auVar14._12_4_;
  auVar88 = vsubps_avx(auVar78,auVar204);
  auVar113 = vrcpss_avx(auVar137,auVar137);
  auVar113 = ZEXT416((uint)(auVar113._0_4_ * (2.0 - fVar95 * auVar113._0_4_)));
  auVar14 = vshufps_avx(auVar113,auVar113,0);
  auVar113 = vdpps_avx(auVar213,auVar213,0x7f);
  fVar299 = auVar113._0_4_;
  auVar253 = ZEXT416((uint)fVar299);
  auVar283 = vrsqrtss_avx(auVar253,auVar253);
  fVar148 = auVar283._0_4_;
  auVar283 = vdpps_avx(auVar213,auVar133,0x7f);
  auVar113 = vshufps_avx(auVar113,auVar113,0);
  auVar333._0_4_ = auVar133._0_4_ * auVar113._0_4_;
  auVar333._4_4_ = auVar133._4_4_ * auVar113._4_4_;
  auVar333._8_4_ = auVar133._8_4_ * auVar113._8_4_;
  auVar333._12_4_ = auVar133._12_4_ * auVar113._12_4_;
  lVar11 = *(long *)(_Var9 + 0x38 + lVar69);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar69);
  pfVar3 = (float *)(lVar11 + lVar12 * uVar64);
  fVar71 = *pfVar3;
  fVar95 = pfVar3[1];
  fVar96 = pfVar3[2];
  fVar147 = pfVar3[3];
  pfVar3 = (float *)(lVar11 + lVar12 * lVar65);
  fVar171 = *pfVar3;
  fVar173 = pfVar3[1];
  fVar175 = pfVar3[2];
  fVar177 = pfVar3[3];
  pfVar3 = (float *)(lVar11 + lVar12 * lVar1);
  fVar195 = *pfVar3;
  fVar197 = pfVar3[1];
  fVar199 = pfVar3[2];
  fVar201 = pfVar3[3];
  auVar113 = vshufps_avx(auVar283,auVar283,0);
  auVar79._0_4_ = auVar113._0_4_ * auVar213._0_4_;
  auVar79._4_4_ = auVar113._4_4_ * auVar213._4_4_;
  auVar79._8_4_ = auVar113._8_4_ * auVar213._8_4_;
  auVar79._12_4_ = auVar113._12_4_ * auVar213._12_4_;
  auVar133 = vsubps_avx(auVar333,auVar79);
  pfVar3 = (float *)(lVar11 + lVar12 * lVar2);
  fVar215 = *pfVar3;
  fVar216 = pfVar3[1];
  fVar217 = pfVar3[2];
  fVar298 = pfVar3[3];
  lVar11 = *(long *)(lVar10 + 0x38 + lVar69);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar69);
  auVar113 = ZEXT416((uint)(fVar148 * 1.5 - fVar299 * 0.5 * fVar148 * fVar148 * fVar148));
  auVar283 = vshufps_avx(auVar113,auVar113,0);
  fVar148 = auVar283._0_4_ * auVar213._0_4_;
  fVar172 = auVar283._4_4_ * auVar213._4_4_;
  fVar174 = auVar283._8_4_ * auVar213._8_4_;
  fVar176 = auVar283._12_4_ * auVar213._12_4_;
  auVar113 = vrcpss_avx(auVar253,auVar253);
  auVar113 = ZEXT416((uint)(auVar113._0_4_ * (2.0 - auVar113._0_4_ * fVar299)));
  auVar113 = vshufps_avx(auVar113,auVar113,0);
  auVar253 = vshufps_avx(_local_498,_local_498,0xff);
  auVar304._0_4_ = auVar253._0_4_ * fVar178;
  auVar304._4_4_ = auVar253._4_4_ * fVar196;
  auVar304._8_4_ = auVar253._8_4_ * fVar198;
  auVar304._12_4_ = auVar253._12_4_ * fVar200;
  auVar213 = vshufps_avx(auVar163,auVar163,0xff);
  auVar137 = vsubps_avx(_local_498,auVar304);
  auVar239._0_4_ =
       auVar213._0_4_ * fVar178 + auVar253._0_4_ * auVar112._0_4_ * auVar88._0_4_ * auVar14._0_4_;
  auVar239._4_4_ =
       auVar213._4_4_ * fVar196 + auVar253._4_4_ * auVar112._4_4_ * auVar88._4_4_ * auVar14._4_4_;
  auVar239._8_4_ =
       auVar213._8_4_ * fVar198 + auVar253._8_4_ * auVar112._8_4_ * auVar88._8_4_ * auVar14._8_4_;
  auVar239._12_4_ =
       auVar213._12_4_ * fVar200 +
       auVar253._12_4_ * auVar112._12_4_ * auVar88._12_4_ * auVar14._12_4_;
  auVar88 = vsubps_avx(auVar163,auVar239);
  local_498._0_4_ = auVar304._0_4_ + (float)local_498._0_4_;
  local_498._4_4_ = auVar304._4_4_ + (float)local_498._4_4_;
  fStack_490 = auVar304._8_4_ + fStack_490;
  fStack_48c = auVar304._12_4_ + fStack_48c;
  auVar14 = vshufps_avx(_local_428,_local_428,0xff);
  auVar129._0_4_ = auVar14._0_4_ * fVar148;
  auVar129._4_4_ = auVar14._4_4_ * fVar172;
  auVar129._8_4_ = auVar14._8_4_ * fVar174;
  auVar129._12_4_ = auVar14._12_4_ * fVar176;
  auVar253 = vshufps_avx(auVar267,auVar267,0xff);
  auVar15 = vsubps_avx(_local_428,auVar129);
  auVar80._0_4_ =
       auVar253._0_4_ * fVar148 + auVar14._0_4_ * auVar283._0_4_ * auVar133._0_4_ * auVar113._0_4_;
  auVar80._4_4_ =
       auVar253._4_4_ * fVar172 + auVar14._4_4_ * auVar283._4_4_ * auVar133._4_4_ * auVar113._4_4_;
  auVar80._8_4_ =
       auVar253._8_4_ * fVar174 + auVar14._8_4_ * auVar283._8_4_ * auVar133._8_4_ * auVar113._8_4_;
  auVar80._12_4_ =
       auVar253._12_4_ * fVar176 +
       auVar14._12_4_ * auVar283._12_4_ * auVar133._12_4_ * auVar113._12_4_;
  auVar16 = vsubps_avx(auVar267,auVar80);
  local_428._0_4_ = (float)local_428._0_4_ + auVar129._0_4_;
  local_428._4_4_ = (float)local_428._4_4_ + auVar129._4_4_;
  fStack_420 = fStack_420 + auVar129._8_4_;
  fStack_41c = fStack_41c + auVar129._12_4_;
  auVar81._0_4_ = fVar171 * 0.0 + fVar195 * 0.5 + fVar215 * 0.0;
  auVar81._4_4_ = fVar173 * 0.0 + fVar197 * 0.5 + fVar216 * 0.0;
  auVar81._8_4_ = fVar175 * 0.0 + fVar199 * 0.5 + fVar217 * 0.0;
  auVar81._12_4_ = fVar177 * 0.0 + fVar201 * 0.5 + fVar298 * 0.0;
  auVar100._0_4_ = fVar71 * 0.5;
  auVar100._4_4_ = fVar95 * 0.5;
  auVar100._8_4_ = fVar96 * 0.5;
  auVar100._12_4_ = fVar147 * 0.5;
  auVar72 = vsubps_avx(auVar81,auVar100);
  pfVar3 = (float *)(lVar11 + lVar1 * lVar10);
  fVar148 = *pfVar3;
  fVar172 = pfVar3[1];
  fVar174 = pfVar3[2];
  fVar176 = pfVar3[3];
  auVar113 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar2);
  fVar302 = auVar113._0_4_;
  fVar231 = auVar113._4_4_;
  fVar308 = auVar113._8_4_;
  fVar232 = auVar113._12_4_;
  pfVar3 = (float *)(lVar11 + lVar65 * lVar10);
  fVar178 = *pfVar3;
  fVar196 = pfVar3[1];
  fVar198 = pfVar3[2];
  fVar200 = pfVar3[3];
  auVar221._0_4_ = fVar178 * 0.0 + fVar302 * 0.0 + fVar148 * 0.5;
  auVar221._4_4_ = fVar196 * 0.0 + fVar231 * 0.0 + fVar172 * 0.5;
  auVar221._8_4_ = fVar198 * 0.0 + fVar308 * 0.0 + fVar174 * 0.5;
  auVar221._12_4_ = fVar200 * 0.0 + fVar232 * 0.0 + fVar176 * 0.5;
  pfVar3 = (float *)(lVar11 + uVar64 * lVar10);
  fVar299 = *pfVar3;
  fVar300 = pfVar3[1];
  fVar301 = pfVar3[2];
  fVar230 = pfVar3[3];
  auVar254._0_4_ = fVar299 * 0.5;
  auVar254._4_4_ = fVar300 * 0.5;
  auVar254._8_4_ = fVar301 * 0.5;
  auVar254._12_4_ = fVar230 * 0.5;
  auVar283 = vsubps_avx(auVar221,auVar254);
  auVar255._0_4_ = fVar71 * -0.0 + fVar171 + fVar195 * 0.0 + fVar215 * -0.0;
  auVar255._4_4_ = fVar95 * -0.0 + fVar173 + fVar197 * 0.0 + fVar216 * -0.0;
  auVar255._8_4_ = fVar96 * -0.0 + fVar175 + fVar199 * 0.0 + fVar217 * -0.0;
  auVar255._12_4_ = fVar147 * -0.0 + fVar177 + fVar201 * 0.0 + fVar298 * -0.0;
  local_448._0_4_ = fVar71 * -0.0 + fVar171 * 0.0 + fVar195 + fVar215 * -0.0;
  local_448._4_4_ = fVar95 * -0.0 + fVar173 * 0.0 + fVar197 + fVar216 * -0.0;
  fStack_440 = fVar96 * -0.0 + fVar175 * 0.0 + fVar199 + fVar217 * -0.0;
  fStack_43c = fVar147 * -0.0 + fVar177 * 0.0 + fVar201 + fVar298 * -0.0;
  auVar279._0_4_ = fVar195 * 0.0 + fVar215 * 0.5;
  auVar279._4_4_ = fVar197 * 0.0 + fVar216 * 0.5;
  auVar279._8_4_ = fVar199 * 0.0 + fVar217 * 0.5;
  auVar279._12_4_ = fVar201 * 0.0 + fVar298 * 0.5;
  auVar305._0_4_ = fVar171 * 0.5;
  auVar305._4_4_ = fVar173 * 0.5;
  auVar305._8_4_ = fVar175 * 0.5;
  auVar305._12_4_ = fVar177 * 0.5;
  auVar113 = vsubps_avx(auVar279,auVar305);
  auVar292._0_4_ = fVar71 * 0.0 + auVar113._0_4_;
  auVar292._4_4_ = fVar95 * 0.0 + auVar113._4_4_;
  auVar292._8_4_ = fVar96 * 0.0 + auVar113._8_4_;
  auVar292._12_4_ = fVar147 * 0.0 + auVar113._12_4_;
  auVar280._0_4_ = fVar299 * -0.0 + fVar178 + fVar302 * -0.0 + fVar148 * 0.0;
  auVar280._4_4_ = fVar300 * -0.0 + fVar196 + fVar231 * -0.0 + fVar172 * 0.0;
  auVar280._8_4_ = fVar301 * -0.0 + fVar198 + fVar308 * -0.0 + fVar174 * 0.0;
  auVar280._12_4_ = fVar230 * -0.0 + fVar200 + fVar232 * -0.0 + fVar176 * 0.0;
  auVar101._0_4_ = fVar299 * -0.0 + fVar302 * -0.0 + fVar148 + fVar178 * 0.0;
  auVar101._4_4_ = fVar300 * -0.0 + fVar231 * -0.0 + fVar172 + fVar196 * 0.0;
  auVar101._8_4_ = fVar301 * -0.0 + fVar308 * -0.0 + fVar174 + fVar198 * 0.0;
  auVar101._12_4_ = fVar230 * -0.0 + fVar232 * -0.0 + fVar176 + fVar200 * 0.0;
  auVar130._0_4_ = fVar148 * 0.0 + fVar302 * 0.5;
  auVar130._4_4_ = fVar172 * 0.0 + fVar231 * 0.5;
  auVar130._8_4_ = fVar174 * 0.0 + fVar308 * 0.5;
  auVar130._12_4_ = fVar176 * 0.0 + fVar232 * 0.5;
  auVar153._0_4_ = fVar178 * 0.5;
  auVar153._4_4_ = fVar196 * 0.5;
  auVar153._8_4_ = fVar198 * 0.5;
  auVar153._12_4_ = fVar200 * 0.5;
  auVar113 = vsubps_avx(auVar130,auVar153);
  auVar131._0_4_ = fVar299 * 0.0 + auVar113._0_4_;
  auVar131._4_4_ = fVar300 * 0.0 + auVar113._4_4_;
  auVar131._8_4_ = fVar301 * 0.0 + auVar113._8_4_;
  auVar131._12_4_ = fVar230 * 0.0 + auVar113._12_4_;
  auVar113 = vshufps_avx(auVar280,auVar280,0xc9);
  fVar195 = auVar72._0_4_;
  auVar82._0_4_ = fVar195 * auVar113._0_4_;
  fVar197 = auVar72._4_4_;
  auVar82._4_4_ = fVar197 * auVar113._4_4_;
  fVar199 = auVar72._8_4_;
  auVar82._8_4_ = fVar199 * auVar113._8_4_;
  fVar201 = auVar72._12_4_;
  auVar82._12_4_ = fVar201 * auVar113._12_4_;
  auVar113 = vshufps_avx(auVar72,auVar72,0xc9);
  auVar281._0_4_ = auVar280._0_4_ * auVar113._0_4_;
  auVar281._4_4_ = auVar280._4_4_ * auVar113._4_4_;
  auVar281._8_4_ = auVar280._8_4_ * auVar113._8_4_;
  auVar281._12_4_ = auVar280._12_4_ * auVar113._12_4_;
  auVar14 = vsubps_avx(auVar281,auVar82);
  auVar83._0_4_ = auVar113._0_4_ * auVar283._0_4_;
  auVar83._4_4_ = auVar113._4_4_ * auVar283._4_4_;
  auVar83._8_4_ = auVar113._8_4_ * auVar283._8_4_;
  auVar83._12_4_ = auVar113._12_4_ * auVar283._12_4_;
  auVar113 = vshufps_avx(auVar283,auVar283,0xc9);
  auVar154._0_4_ = fVar195 * auVar113._0_4_;
  auVar154._4_4_ = fVar197 * auVar113._4_4_;
  auVar154._8_4_ = fVar199 * auVar113._8_4_;
  auVar154._12_4_ = fVar201 * auVar113._12_4_;
  auVar253 = vsubps_avx(auVar83,auVar154);
  auVar113 = vshufps_avx(auVar101,auVar101,0xc9);
  auVar84._0_4_ = auVar292._0_4_ * auVar113._0_4_;
  auVar84._4_4_ = auVar292._4_4_ * auVar113._4_4_;
  auVar84._8_4_ = auVar292._8_4_ * auVar113._8_4_;
  auVar84._12_4_ = auVar292._12_4_ * auVar113._12_4_;
  auVar113 = vshufps_avx(auVar292,auVar292,0xc9);
  auVar102._0_4_ = auVar113._0_4_ * auVar101._0_4_;
  auVar102._4_4_ = auVar113._4_4_ * auVar101._4_4_;
  auVar102._8_4_ = auVar113._8_4_ * auVar101._8_4_;
  auVar102._12_4_ = auVar113._12_4_ * auVar101._12_4_;
  auVar213 = vsubps_avx(auVar102,auVar84);
  auVar14 = vshufps_avx(auVar14,auVar14,0xc9);
  auVar103._0_4_ = auVar113._0_4_ * auVar131._0_4_;
  auVar103._4_4_ = auVar113._4_4_ * auVar131._4_4_;
  auVar103._8_4_ = auVar113._8_4_ * auVar131._8_4_;
  auVar103._12_4_ = auVar113._12_4_ * auVar131._12_4_;
  auVar283 = vshufps_avx(auVar131,auVar131,0xc9);
  auVar113 = vdpps_avx(auVar14,auVar14,0x7f);
  auVar132._0_4_ = auVar292._0_4_ * auVar283._0_4_;
  auVar132._4_4_ = auVar292._4_4_ * auVar283._4_4_;
  auVar132._8_4_ = auVar292._8_4_ * auVar283._8_4_;
  auVar132._12_4_ = auVar292._12_4_ * auVar283._12_4_;
  auVar112 = vsubps_avx(auVar103,auVar132);
  auVar253 = vshufps_avx(auVar253,auVar253,0xc9);
  fVar95 = auVar113._0_4_;
  auVar133 = ZEXT416((uint)fVar95);
  auVar283 = vrsqrtss_avx(auVar133,auVar133);
  fVar71 = auVar283._0_4_;
  auVar283 = vdpps_avx(auVar14,auVar253,0x7f);
  auVar113 = vshufps_avx(auVar113,auVar113,0);
  auVar104._0_4_ = auVar113._0_4_ * auVar253._0_4_;
  auVar104._4_4_ = auVar113._4_4_ * auVar253._4_4_;
  auVar104._8_4_ = auVar113._8_4_ * auVar253._8_4_;
  auVar104._12_4_ = auVar113._12_4_ * auVar253._12_4_;
  auVar113 = vshufps_avx(auVar283,auVar283,0);
  auVar282._0_4_ = auVar113._0_4_ * auVar14._0_4_;
  auVar282._4_4_ = auVar113._4_4_ * auVar14._4_4_;
  auVar282._8_4_ = auVar113._8_4_ * auVar14._8_4_;
  auVar282._12_4_ = auVar113._12_4_ * auVar14._12_4_;
  auVar73 = vsubps_avx(auVar104,auVar282);
  auVar113 = vrcpss_avx(auVar133,auVar133);
  auVar113 = ZEXT416((uint)(auVar113._0_4_ * (2.0 - fVar95 * auVar113._0_4_)));
  auVar253 = vshufps_avx(auVar113,auVar113,0);
  auVar213 = vshufps_avx(auVar213,auVar213,0xc9);
  auVar113 = ZEXT416((uint)(fVar71 * 1.5 - fVar95 * 0.5 * fVar71 * fVar71 * fVar71));
  auVar133 = vshufps_avx(auVar113,auVar113,0);
  auVar283 = vdpps_avx(auVar213,auVar213,0x7f);
  fVar71 = auVar14._0_4_ * auVar133._0_4_;
  fVar95 = auVar14._4_4_ * auVar133._4_4_;
  fVar96 = auVar14._8_4_ * auVar133._8_4_;
  fVar147 = auVar14._12_4_ * auVar133._12_4_;
  auVar112 = vshufps_avx(auVar112,auVar112,0xc9);
  auVar113 = vblendps_avx(auVar283,_DAT_01feba10,0xe);
  auVar14 = vrsqrtss_avx(auVar113,auVar113);
  fVar171 = auVar14._0_4_;
  auVar14 = vdpps_avx(auVar213,auVar112,0x7f);
  auVar163 = vshufps_avx(auVar283,auVar283,0);
  auVar134._0_4_ = auVar163._0_4_ * auVar112._0_4_;
  auVar134._4_4_ = auVar163._4_4_ * auVar112._4_4_;
  auVar134._8_4_ = auVar163._8_4_ * auVar112._8_4_;
  auVar134._12_4_ = auVar163._12_4_ * auVar112._12_4_;
  auVar14 = vshufps_avx(auVar14,auVar14,0);
  auVar306._0_4_ = auVar14._0_4_ * auVar213._0_4_;
  auVar306._4_4_ = auVar14._4_4_ * auVar213._4_4_;
  auVar306._8_4_ = auVar14._8_4_ * auVar213._8_4_;
  auVar306._12_4_ = auVar14._12_4_ * auVar213._12_4_;
  auVar112 = vsubps_avx(auVar134,auVar306);
  auVar113 = vrcpss_avx(auVar113,auVar113);
  auVar113 = ZEXT416((uint)(auVar113._0_4_ * (2.0 - auVar283._0_4_ * auVar113._0_4_)));
  auVar113 = vshufps_avx(auVar113,auVar113,0);
  auVar283 = ZEXT416((uint)(fVar171 * 1.5 - auVar283._0_4_ * 0.5 * fVar171 * fVar171 * fVar171));
  auVar283 = vshufps_avx(auVar283,auVar283,0);
  fVar171 = auVar213._0_4_ * auVar283._0_4_;
  fVar173 = auVar213._4_4_ * auVar283._4_4_;
  fVar175 = auVar213._8_4_ * auVar283._8_4_;
  fVar177 = auVar213._12_4_ * auVar283._12_4_;
  auVar14 = vshufps_avx(auVar72,auVar72,0xff);
  auVar213 = vshufps_avx(auVar255,auVar255,0xff);
  auVar85._0_4_ = auVar213._0_4_ * fVar71;
  auVar85._4_4_ = auVar213._4_4_ * fVar95;
  auVar85._8_4_ = auVar213._8_4_ * fVar96;
  auVar85._12_4_ = auVar213._12_4_ * fVar147;
  auVar105._0_4_ =
       auVar14._0_4_ * fVar71 + auVar213._0_4_ * auVar133._0_4_ * auVar73._0_4_ * auVar253._0_4_;
  auVar105._4_4_ =
       auVar14._4_4_ * fVar95 + auVar213._4_4_ * auVar133._4_4_ * auVar73._4_4_ * auVar253._4_4_;
  auVar105._8_4_ =
       auVar14._8_4_ * fVar96 + auVar213._8_4_ * auVar133._8_4_ * auVar73._8_4_ * auVar253._8_4_;
  auVar105._12_4_ =
       auVar14._12_4_ * fVar147 +
       auVar213._12_4_ * auVar133._12_4_ * auVar73._12_4_ * auVar253._12_4_;
  auVar213 = vsubps_avx(auVar255,auVar85);
  auVar133 = vsubps_avx(auVar72,auVar105);
  auVar14 = vshufps_avx(auVar292,auVar292,0xff);
  auVar253 = vshufps_avx(_local_448,_local_448,0xff);
  auVar222._0_4_ = auVar253._0_4_ * fVar171;
  auVar222._4_4_ = auVar253._4_4_ * fVar173;
  auVar222._8_4_ = auVar253._8_4_ * fVar175;
  auVar222._12_4_ = auVar253._12_4_ * fVar177;
  auVar106._0_4_ =
       auVar14._0_4_ * fVar171 + auVar253._0_4_ * auVar283._0_4_ * auVar112._0_4_ * auVar113._0_4_;
  auVar106._4_4_ =
       auVar14._4_4_ * fVar173 + auVar253._4_4_ * auVar283._4_4_ * auVar112._4_4_ * auVar113._4_4_;
  auVar106._8_4_ =
       auVar14._8_4_ * fVar175 + auVar253._8_4_ * auVar283._8_4_ * auVar112._8_4_ * auVar113._8_4_;
  auVar106._12_4_ =
       auVar14._12_4_ * fVar177 +
       auVar253._12_4_ * auVar283._12_4_ * auVar112._12_4_ * auVar113._12_4_;
  auVar14 = vsubps_avx(_local_448,auVar222);
  local_448._0_4_ = (float)local_448._0_4_ + auVar222._0_4_;
  local_448._4_4_ = (float)local_448._4_4_ + auVar222._4_4_;
  fStack_440 = fStack_440 + auVar222._8_4_;
  fStack_43c = fStack_43c + auVar222._12_4_;
  auVar253 = vsubps_avx(auVar292,auVar106);
  local_3a8._0_4_ = auVar88._0_4_;
  local_3a8._4_4_ = auVar88._4_4_;
  fStack_3a0 = auVar88._8_4_;
  fStack_39c = auVar88._12_4_;
  local_3e8._0_4_ = auVar137._0_4_;
  local_3e8._4_4_ = auVar137._4_4_;
  fStack_3e0 = auVar137._8_4_;
  fStack_3dc = auVar137._12_4_;
  auVar113 = vshufps_avx(ZEXT416((uint)fVar97),ZEXT416((uint)fVar97),0);
  auVar283 = vshufps_avx(ZEXT416((uint)(1.0 - fVar97)),ZEXT416((uint)(1.0 - fVar97)),0);
  fVar147 = auVar113._0_4_;
  fVar171 = auVar113._4_4_;
  fVar173 = auVar113._8_4_;
  fVar175 = auVar113._12_4_;
  fVar97 = auVar283._0_4_;
  fVar71 = auVar283._4_4_;
  fVar95 = auVar283._8_4_;
  fVar96 = auVar283._12_4_;
  local_328._0_4_ = fVar97 * (float)local_3e8._0_4_ + fVar147 * auVar213._0_4_;
  local_328._4_4_ = fVar71 * (float)local_3e8._4_4_ + fVar171 * auVar213._4_4_;
  fStack_320 = fVar95 * fStack_3e0 + fVar173 * auVar213._8_4_;
  fStack_31c = fVar96 * fStack_3dc + fVar175 * auVar213._12_4_;
  local_338._0_4_ =
       fVar97 * ((float)local_3e8._0_4_ + (float)local_3a8._0_4_ * 0.33333334) +
       fVar147 * (auVar213._0_4_ + auVar133._0_4_ * 0.33333334);
  local_338._4_4_ =
       fVar71 * ((float)local_3e8._4_4_ + (float)local_3a8._4_4_ * 0.33333334) +
       fVar171 * (auVar213._4_4_ + auVar133._4_4_ * 0.33333334);
  fStack_330 = fVar95 * (fStack_3e0 + fStack_3a0 * 0.33333334) +
               fVar173 * (auVar213._8_4_ + auVar133._8_4_ * 0.33333334);
  fStack_32c = fVar96 * (fStack_3dc + fStack_39c * 0.33333334) +
               fVar175 * (auVar213._12_4_ + auVar133._12_4_ * 0.33333334);
  local_3c8._0_4_ = auVar16._0_4_;
  local_3c8._4_4_ = auVar16._4_4_;
  fStack_3c0 = auVar16._8_4_;
  fStack_3bc = auVar16._12_4_;
  auVar155._0_4_ = (float)local_3c8._0_4_ * 0.33333334;
  auVar155._4_4_ = (float)local_3c8._4_4_ * 0.33333334;
  auVar155._8_4_ = fStack_3c0 * 0.33333334;
  auVar155._12_4_ = fStack_3bc * 0.33333334;
  auVar113 = vsubps_avx(auVar15,auVar155);
  auVar223._0_4_ = (auVar267._0_4_ + auVar80._0_4_) * 0.33333334;
  auVar223._4_4_ = (auVar267._4_4_ + auVar80._4_4_) * 0.33333334;
  auVar223._8_4_ = (auVar267._8_4_ + auVar80._8_4_) * 0.33333334;
  auVar223._12_4_ = (auVar267._12_4_ + auVar80._12_4_) * 0.33333334;
  auVar283 = vsubps_avx(_local_428,auVar223);
  auVar135._0_4_ = auVar253._0_4_ * 0.33333334;
  auVar135._4_4_ = auVar253._4_4_ * 0.33333334;
  auVar135._8_4_ = auVar253._8_4_ * 0.33333334;
  auVar135._12_4_ = auVar253._12_4_ * 0.33333334;
  auVar253 = vsubps_avx(auVar14,auVar135);
  auVar284._0_4_ = (auVar292._0_4_ + auVar106._0_4_) * 0.33333334;
  auVar284._4_4_ = (auVar292._4_4_ + auVar106._4_4_) * 0.33333334;
  auVar284._8_4_ = (auVar292._8_4_ + auVar106._8_4_) * 0.33333334;
  auVar284._12_4_ = (auVar292._12_4_ + auVar106._12_4_) * 0.33333334;
  auVar213 = vsubps_avx(_local_448,auVar284);
  local_348._0_4_ = fVar97 * auVar113._0_4_ + fVar147 * auVar253._0_4_;
  local_348._4_4_ = fVar71 * auVar113._4_4_ + fVar171 * auVar253._4_4_;
  fStack_340 = fVar95 * auVar113._8_4_ + fVar173 * auVar253._8_4_;
  fStack_33c = fVar96 * auVar113._12_4_ + fVar175 * auVar253._12_4_;
  local_388 = fVar147 * auVar14._0_4_ + fVar97 * auVar15._0_4_;
  fStack_384 = fVar171 * auVar14._4_4_ + fVar71 * auVar15._4_4_;
  fStack_380 = fVar173 * auVar14._8_4_ + fVar95 * auVar15._8_4_;
  fStack_37c = fVar175 * auVar14._12_4_ + fVar96 * auVar15._12_4_;
  local_358._0_4_ = (float)local_498._0_4_ * fVar97 + fVar147 * (auVar255._0_4_ + auVar85._0_4_);
  local_358._4_4_ = (float)local_498._4_4_ * fVar71 + fVar171 * (auVar255._4_4_ + auVar85._4_4_);
  fStack_350 = fStack_490 * fVar95 + fVar173 * (auVar255._8_4_ + auVar85._8_4_);
  fStack_34c = fStack_48c * fVar96 + fVar175 * (auVar255._12_4_ + auVar85._12_4_);
  local_368._0_4_ =
       fVar97 * ((float)local_498._0_4_ + (fVar309 + auVar239._0_4_) * 0.33333334) +
       fVar147 * (auVar255._0_4_ + auVar85._0_4_ + (fVar195 + auVar105._0_4_) * 0.33333334);
  local_368._4_4_ =
       fVar71 * ((float)local_498._4_4_ + (fVar310 + auVar239._4_4_) * 0.33333334) +
       fVar171 * (auVar255._4_4_ + auVar85._4_4_ + (fVar197 + auVar105._4_4_) * 0.33333334);
  fStack_360 = fVar95 * (fStack_490 + (fVar311 + auVar239._8_4_) * 0.33333334) +
               fVar173 * (auVar255._8_4_ + auVar85._8_4_ + (fVar199 + auVar105._8_4_) * 0.33333334);
  fStack_35c = fVar96 * (fStack_48c + (fVar313 + auVar239._12_4_) * 0.33333334) +
               fVar175 * (auVar255._12_4_ + auVar85._12_4_ +
                         (fVar201 + auVar105._12_4_) * 0.33333334);
  local_378._0_4_ = fVar97 * auVar283._0_4_ + fVar147 * auVar213._0_4_;
  local_378._4_4_ = fVar71 * auVar283._4_4_ + fVar171 * auVar213._4_4_;
  fStack_370 = fVar95 * auVar283._8_4_ + fVar173 * auVar213._8_4_;
  fStack_36c = fVar96 * auVar283._12_4_ + fVar175 * auVar213._12_4_;
  local_298._0_4_ = (float)local_428._0_4_ * fVar97 + fVar147 * (float)local_448._0_4_;
  local_298._4_4_ = (float)local_428._4_4_ * fVar71 + fVar171 * (float)local_448._4_4_;
  fStack_290 = fStack_420 * fVar95 + fVar173 * fStack_440;
  fStack_28c = fStack_41c * fVar96 + fVar175 * fStack_43c;
  aVar6 = (ray->org).field_0;
  auVar14 = vsubps_avx(_local_328,(undefined1  [16])aVar6);
  auVar283 = vmovsldup_avx(auVar14);
  auVar113 = vmovshdup_avx(auVar14);
  auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
  fVar97 = (pre->ray_space).vx.field_0.m128[0];
  fVar71 = (pre->ray_space).vx.field_0.m128[1];
  fVar95 = (pre->ray_space).vx.field_0.m128[2];
  fVar96 = (pre->ray_space).vx.field_0.m128[3];
  fVar147 = (pre->ray_space).vy.field_0.m128[0];
  fVar171 = (pre->ray_space).vy.field_0.m128[1];
  fVar173 = (pre->ray_space).vy.field_0.m128[2];
  fVar175 = (pre->ray_space).vy.field_0.m128[3];
  fVar177 = (pre->ray_space).vz.field_0.m128[0];
  fVar195 = (pre->ray_space).vz.field_0.m128[1];
  fVar197 = (pre->ray_space).vz.field_0.m128[2];
  fVar199 = (pre->ray_space).vz.field_0.m128[3];
  local_478._4_4_ = fVar71 * auVar283._4_4_ + fVar171 * auVar113._4_4_ + fVar195 * auVar14._4_4_;
  local_478._0_4_ = fVar97 * auVar283._0_4_ + fVar147 * auVar113._0_4_ + fVar177 * auVar14._0_4_;
  fStack_470 = fVar95 * auVar283._8_4_ + fVar173 * auVar113._8_4_ + fVar197 * auVar14._8_4_;
  fStack_46c = fVar96 * auVar283._12_4_ + fVar175 * auVar113._12_4_ + fVar199 * auVar14._12_4_;
  auVar14 = vsubps_avx(_local_338,(undefined1  [16])aVar6);
  auVar283 = vmovsldup_avx(auVar14);
  auVar113 = vmovshdup_avx(auVar14);
  auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
  auVar107._0_8_ =
       CONCAT44(fVar71 * auVar283._4_4_ + fVar171 * auVar113._4_4_ + fVar195 * auVar14._4_4_,
                fVar97 * auVar283._0_4_ + fVar147 * auVar113._0_4_ + fVar177 * auVar14._0_4_);
  auVar107._8_4_ = fVar95 * auVar283._8_4_ + fVar173 * auVar113._8_4_ + fVar197 * auVar14._8_4_;
  auVar107._12_4_ = fVar96 * auVar283._12_4_ + fVar175 * auVar113._12_4_ + fVar199 * auVar14._12_4_;
  auVar283 = vsubps_avx(_local_348,(undefined1  [16])aVar6);
  auVar14 = vshufps_avx(auVar283,auVar283,0xaa);
  auVar113 = vmovshdup_avx(auVar283);
  auVar283 = vmovsldup_avx(auVar283);
  auVar156._0_8_ =
       CONCAT44(fVar71 * auVar283._4_4_ + auVar113._4_4_ * fVar171 + fVar195 * auVar14._4_4_,
                fVar97 * auVar283._0_4_ + auVar113._0_4_ * fVar147 + fVar177 * auVar14._0_4_);
  auVar156._8_4_ = fVar95 * auVar283._8_4_ + auVar113._8_4_ * fVar173 + fVar197 * auVar14._8_4_;
  auVar156._12_4_ = fVar96 * auVar283._12_4_ + auVar113._12_4_ * fVar175 + fVar199 * auVar14._12_4_;
  auVar56._4_4_ = fStack_384;
  auVar56._0_4_ = local_388;
  auVar56._8_4_ = fStack_380;
  auVar56._12_4_ = fStack_37c;
  auVar283 = vsubps_avx(auVar56,(undefined1  [16])aVar6);
  auVar14 = vshufps_avx(auVar283,auVar283,0xaa);
  auVar113 = vmovshdup_avx(auVar283);
  auVar283 = vmovsldup_avx(auVar283);
  auVar240._0_4_ = auVar113._0_4_ * fVar147 + auVar14._0_4_ * fVar177 + fVar97 * auVar283._0_4_;
  auVar240._4_4_ = auVar113._4_4_ * fVar171 + auVar14._4_4_ * fVar195 + fVar71 * auVar283._4_4_;
  auVar240._8_4_ = auVar113._8_4_ * fVar173 + auVar14._8_4_ * fVar197 + fVar95 * auVar283._8_4_;
  auVar240._12_4_ = auVar113._12_4_ * fVar175 + auVar14._12_4_ * fVar199 + fVar96 * auVar283._12_4_;
  auVar283 = vsubps_avx(_local_358,(undefined1  [16])aVar6);
  auVar14 = vshufps_avx(auVar283,auVar283,0xaa);
  auVar113 = vmovshdup_avx(auVar283);
  auVar283 = vmovsldup_avx(auVar283);
  auVar256._0_4_ = auVar283._0_4_ * fVar97 + auVar113._0_4_ * fVar147 + auVar14._0_4_ * fVar177;
  auVar256._4_4_ = auVar283._4_4_ * fVar71 + auVar113._4_4_ * fVar171 + auVar14._4_4_ * fVar195;
  auVar256._8_4_ = auVar283._8_4_ * fVar95 + auVar113._8_4_ * fVar173 + auVar14._8_4_ * fVar197;
  auVar256._12_4_ = auVar283._12_4_ * fVar96 + auVar113._12_4_ * fVar175 + auVar14._12_4_ * fVar199;
  auVar283 = vsubps_avx(_local_368,(undefined1  [16])aVar6);
  auVar14 = vshufps_avx(auVar283,auVar283,0xaa);
  auVar113 = vmovshdup_avx(auVar283);
  auVar283 = vmovsldup_avx(auVar283);
  auVar268._0_4_ = auVar283._0_4_ * fVar97 + auVar113._0_4_ * fVar147 + auVar14._0_4_ * fVar177;
  auVar268._4_4_ = auVar283._4_4_ * fVar71 + auVar113._4_4_ * fVar171 + auVar14._4_4_ * fVar195;
  auVar268._8_4_ = auVar283._8_4_ * fVar95 + auVar113._8_4_ * fVar173 + auVar14._8_4_ * fVar197;
  auVar268._12_4_ = auVar283._12_4_ * fVar96 + auVar113._12_4_ * fVar175 + auVar14._12_4_ * fVar199;
  auVar283 = vsubps_avx(_local_378,(undefined1  [16])aVar6);
  auVar14 = vshufps_avx(auVar283,auVar283,0xaa);
  auVar113 = vmovshdup_avx(auVar283);
  auVar283 = vmovsldup_avx(auVar283);
  auVar285._0_4_ = auVar283._0_4_ * fVar97 + auVar113._0_4_ * fVar147 + auVar14._0_4_ * fVar177;
  auVar285._4_4_ = auVar283._4_4_ * fVar71 + auVar113._4_4_ * fVar171 + auVar14._4_4_ * fVar195;
  auVar285._8_4_ = auVar283._8_4_ * fVar95 + auVar113._8_4_ * fVar173 + auVar14._8_4_ * fVar197;
  auVar285._12_4_ = auVar283._12_4_ * fVar96 + auVar113._12_4_ * fVar175 + auVar14._12_4_ * fVar199;
  auVar283 = vsubps_avx(_local_298,(undefined1  [16])aVar6);
  auVar14 = vshufps_avx(auVar283,auVar283,0xaa);
  auVar113 = vmovshdup_avx(auVar283);
  auVar283 = vmovsldup_avx(auVar283);
  auVar86._0_8_ =
       CONCAT44(fVar71 * auVar283._4_4_ + auVar113._4_4_ * fVar171 + auVar14._4_4_ * fVar195,
                fVar97 * auVar283._0_4_ + auVar113._0_4_ * fVar147 + auVar14._0_4_ * fVar177);
  auVar86._8_4_ = fVar95 * auVar283._8_4_ + auVar113._8_4_ * fVar173 + auVar14._8_4_ * fVar197;
  auVar86._12_4_ = fVar96 * auVar283._12_4_ + auVar113._12_4_ * fVar175 + auVar14._12_4_ * fVar199;
  auVar253 = vmovlhps_avx(_local_478,auVar256);
  _local_3b8 = vmovlhps_avx(auVar107,auVar268);
  _local_3c8 = vmovlhps_avx(auVar156,auVar285);
  _local_288 = vmovlhps_avx(auVar240,auVar86);
  auVar113 = vminps_avx(auVar253,_local_3b8);
  auVar283 = vminps_avx(_local_3c8,_local_288);
  auVar14 = vminps_avx(auVar113,auVar283);
  auVar113 = vmaxps_avx(auVar253,_local_3b8);
  auVar283 = vmaxps_avx(_local_3c8,_local_288);
  auVar113 = vmaxps_avx(auVar113,auVar283);
  auVar283 = vshufpd_avx(auVar14,auVar14,3);
  auVar14 = vminps_avx(auVar14,auVar283);
  auVar283 = vshufpd_avx(auVar113,auVar113,3);
  auVar283 = vmaxps_avx(auVar113,auVar283);
  auVar224._8_4_ = 0x7fffffff;
  auVar224._0_8_ = 0x7fffffff7fffffff;
  auVar224._12_4_ = 0x7fffffff;
  auVar113 = vandps_avx(auVar14,auVar224);
  auVar283 = vandps_avx(auVar283,auVar224);
  auVar113 = vmaxps_avx(auVar113,auVar283);
  auVar283 = vmovshdup_avx(auVar113);
  auVar113 = vmaxss_avx(auVar283,auVar113);
  fVar97 = auVar113._0_4_ * 9.536743e-07;
  register0x00001388 = local_478;
  local_2f8 = local_478;
  register0x00001548 = auVar107._0_8_;
  local_278 = auVar107._0_8_;
  register0x00001588 = auVar156._0_8_;
  local_308 = auVar156._0_8_;
  register0x000013c8 = auVar86._0_8_;
  local_318 = auVar86._0_8_;
  auVar113 = vshufps_avx(ZEXT416((uint)fVar97),ZEXT416((uint)fVar97),0);
  local_138._16_16_ = auVar113;
  local_138._0_16_ = auVar113;
  auVar87._0_8_ = auVar113._0_8_ ^ 0x8000000080000000;
  auVar87._8_4_ = auVar113._8_4_ ^ 0x80000000;
  auVar87._12_4_ = auVar113._12_4_ ^ 0x80000000;
  local_158._16_16_ = auVar87;
  local_158._0_16_ = auVar87;
  bVar59 = false;
  uVar64 = 0;
  _local_1a8 = vsubps_avx(_local_3b8,auVar253);
  _local_1b8 = vsubps_avx(_local_3c8,_local_3b8);
  _local_1c8 = vsubps_avx(_local_288,_local_3c8);
  _local_1f8 = vsubps_avx(_local_358,_local_328);
  _local_208 = vsubps_avx(_local_368,_local_338);
  _local_218 = vsubps_avx(_local_378,_local_348);
  auVar57._4_4_ = fStack_384;
  auVar57._0_4_ = local_388;
  auVar57._8_4_ = fStack_380;
  auVar57._12_4_ = fStack_37c;
  _local_228 = vsubps_avx(_local_298,auVar57);
  _local_498 = ZEXT816(0x3f80000000000000);
  local_1d8 = _local_498;
  do {
    auVar113 = vshufps_avx(_local_498,_local_498,0x50);
    auVar334._8_4_ = 0x3f800000;
    auVar334._0_8_ = &DAT_3f8000003f800000;
    auVar334._12_4_ = 0x3f800000;
    auVar337._16_4_ = 0x3f800000;
    auVar337._0_16_ = auVar334;
    auVar337._20_4_ = 0x3f800000;
    auVar337._24_4_ = 0x3f800000;
    auVar337._28_4_ = 0x3f800000;
    auVar283 = vsubps_avx(auVar334,auVar113);
    fVar71 = auVar113._0_4_;
    fVar95 = auVar113._4_4_;
    fVar96 = auVar113._8_4_;
    fVar147 = auVar113._12_4_;
    fVar171 = auVar283._0_4_;
    fVar173 = auVar283._4_4_;
    fVar175 = auVar283._8_4_;
    fVar177 = auVar283._12_4_;
    auVar136._0_4_ = auVar256._0_4_ * fVar71 + fVar171 * local_2f8._0_4_;
    auVar136._4_4_ = auVar256._4_4_ * fVar95 + fVar173 * local_2f8._4_4_;
    auVar136._8_4_ = auVar256._0_4_ * fVar96 + fVar175 * local_2f8._8_4_;
    auVar136._12_4_ = auVar256._4_4_ * fVar147 + fVar177 * local_2f8._12_4_;
    auVar108._0_4_ = auVar268._0_4_ * fVar71 + local_278._0_4_ * fVar171;
    auVar108._4_4_ = auVar268._4_4_ * fVar95 + local_278._4_4_ * fVar173;
    auVar108._8_4_ = auVar268._0_4_ * fVar96 + local_278._8_4_ * fVar175;
    auVar108._12_4_ = auVar268._4_4_ * fVar147 + local_278._12_4_ * fVar177;
    auVar241._0_4_ = auVar285._0_4_ * fVar71 + local_308._0_4_ * fVar171;
    auVar241._4_4_ = auVar285._4_4_ * fVar95 + local_308._4_4_ * fVar173;
    auVar241._8_4_ = auVar285._0_4_ * fVar96 + local_308._8_4_ * fVar175;
    auVar241._12_4_ = auVar285._4_4_ * fVar147 + local_308._12_4_ * fVar177;
    auVar157._0_4_ = local_318._0_4_ * fVar71 + auVar240._0_4_ * fVar171;
    auVar157._4_4_ = local_318._4_4_ * fVar95 + auVar240._4_4_ * fVar173;
    auVar157._8_4_ = local_318._8_4_ * fVar96 + auVar240._0_4_ * fVar175;
    auVar157._12_4_ = local_318._12_4_ * fVar147 + auVar240._4_4_ * fVar177;
    auVar113 = vmovshdup_avx(local_1d8);
    auVar283 = vshufps_avx(local_1d8,local_1d8,0);
    auVar264._16_16_ = auVar283;
    auVar264._0_16_ = auVar283;
    auVar14 = vshufps_avx(local_1d8,local_1d8,0x55);
    auVar92._16_16_ = auVar14;
    auVar92._0_16_ = auVar14;
    auVar91 = vsubps_avx(auVar92,auVar264);
    auVar14 = vshufps_avx(auVar136,auVar136,0);
    auVar213 = vshufps_avx(auVar136,auVar136,0x55);
    auVar133 = vshufps_avx(auVar108,auVar108,0);
    auVar112 = vshufps_avx(auVar108,auVar108,0x55);
    auVar163 = vshufps_avx(auVar241,auVar241,0);
    auVar88 = vshufps_avx(auVar241,auVar241,0x55);
    auVar137 = vshufps_avx(auVar157,auVar157,0);
    auVar15 = vshufps_avx(auVar157,auVar157,0x55);
    auVar113 = ZEXT416((uint)((auVar113._0_4_ - local_1d8._0_4_) * 0.04761905));
    auVar113 = vshufps_avx(auVar113,auVar113,0);
    auVar277._0_4_ = auVar283._0_4_ + auVar91._0_4_ * 0.0;
    auVar277._4_4_ = auVar283._4_4_ + auVar91._4_4_ * 0.14285715;
    auVar277._8_4_ = auVar283._8_4_ + auVar91._8_4_ * 0.2857143;
    auVar277._12_4_ = auVar283._12_4_ + auVar91._12_4_ * 0.42857146;
    auVar277._16_4_ = auVar283._0_4_ + auVar91._16_4_ * 0.5714286;
    auVar277._20_4_ = auVar283._4_4_ + auVar91._20_4_ * 0.71428573;
    auVar277._24_4_ = auVar283._8_4_ + auVar91._24_4_ * 0.8571429;
    auVar277._28_4_ = auVar283._12_4_ + auVar91._28_4_;
    auVar19 = vsubps_avx(auVar337,auVar277);
    fVar216 = auVar133._0_4_;
    fVar298 = auVar133._4_4_;
    fVar178 = auVar133._8_4_;
    fVar198 = auVar133._12_4_;
    fVar71 = auVar19._0_4_;
    fVar171 = auVar19._4_4_;
    fVar195 = auVar19._8_4_;
    fVar215 = auVar19._12_4_;
    fVar323 = auVar14._12_4_;
    fVar148 = auVar19._16_4_;
    fVar172 = auVar19._20_4_;
    fVar174 = auVar19._24_4_;
    fVar230 = auVar112._0_4_;
    fVar231 = auVar112._4_4_;
    fVar232 = auVar112._8_4_;
    fVar317 = auVar112._12_4_;
    local_408._0_4_ = auVar213._0_4_;
    local_408._4_4_ = auVar213._4_4_;
    fStack_400 = auVar213._8_4_;
    fStack_3fc = auVar213._12_4_;
    fVar95 = auVar163._0_4_;
    fVar147 = auVar163._4_4_;
    fVar175 = auVar163._8_4_;
    fVar197 = auVar163._12_4_;
    fVar217 = auVar277._0_4_ * fVar95 + fVar216 * fVar71;
    fVar176 = auVar277._4_4_ * fVar147 + fVar298 * fVar171;
    fVar196 = auVar277._8_4_ * fVar175 + fVar178 * fVar195;
    fVar200 = auVar277._12_4_ * fVar197 + fVar198 * fVar215;
    fVar299 = auVar277._16_4_ * fVar95 + fVar216 * fVar148;
    fVar300 = auVar277._20_4_ * fVar147 + fVar298 * fVar172;
    fVar301 = auVar277._24_4_ * fVar175 + fVar178 * fVar174;
    fVar96 = auVar88._0_4_;
    fVar173 = auVar88._4_4_;
    fVar177 = auVar88._8_4_;
    fVar199 = auVar88._12_4_;
    fVar302 = auVar277._0_4_ * fVar96 + fVar230 * fVar71;
    fVar308 = auVar277._4_4_ * fVar173 + fVar231 * fVar171;
    fVar309 = auVar277._8_4_ * fVar177 + fVar232 * fVar195;
    fVar310 = auVar277._12_4_ * fVar199 + fVar317 * fVar215;
    fVar311 = auVar277._16_4_ * fVar96 + fVar230 * fVar148;
    fVar313 = auVar277._20_4_ * fVar173 + fVar231 * fVar172;
    fVar315 = auVar277._24_4_ * fVar177 + fVar232 * fVar174;
    auVar283 = vshufps_avx(auVar136,auVar136,0xaa);
    auVar213 = vshufps_avx(auVar136,auVar136,0xff);
    fVar201 = fVar197 + 0.0;
    auVar133 = vshufps_avx(auVar108,auVar108,0xaa);
    auVar112 = vshufps_avx(auVar108,auVar108,0xff);
    auVar93._0_4_ =
         fVar71 * (fVar216 * auVar277._0_4_ + auVar14._0_4_ * fVar71) + auVar277._0_4_ * fVar217;
    auVar93._4_4_ =
         fVar171 * (fVar298 * auVar277._4_4_ + auVar14._4_4_ * fVar171) + auVar277._4_4_ * fVar176;
    auVar93._8_4_ =
         fVar195 * (fVar178 * auVar277._8_4_ + auVar14._8_4_ * fVar195) + auVar277._8_4_ * fVar196;
    auVar93._12_4_ =
         fVar215 * (fVar198 * auVar277._12_4_ + fVar323 * fVar215) + auVar277._12_4_ * fVar200;
    auVar93._16_4_ =
         fVar148 * (fVar216 * auVar277._16_4_ + auVar14._0_4_ * fVar148) + auVar277._16_4_ * fVar299
    ;
    auVar93._20_4_ =
         fVar172 * (fVar298 * auVar277._20_4_ + auVar14._4_4_ * fVar172) + auVar277._20_4_ * fVar300
    ;
    auVar93._24_4_ =
         fVar174 * (fVar178 * auVar277._24_4_ + auVar14._8_4_ * fVar174) + auVar277._24_4_ * fVar301
    ;
    auVar93._28_4_ = fVar323 + 1.0 + fVar199;
    auVar167._0_4_ =
         fVar71 * (fVar230 * auVar277._0_4_ + fVar71 * (float)local_408._0_4_) +
         auVar277._0_4_ * fVar302;
    auVar167._4_4_ =
         fVar171 * (fVar231 * auVar277._4_4_ + fVar171 * (float)local_408._4_4_) +
         auVar277._4_4_ * fVar308;
    auVar167._8_4_ =
         fVar195 * (fVar232 * auVar277._8_4_ + fVar195 * fStack_400) + auVar277._8_4_ * fVar309;
    auVar167._12_4_ =
         fVar215 * (fVar317 * auVar277._12_4_ + fVar215 * fStack_3fc) + auVar277._12_4_ * fVar310;
    auVar167._16_4_ =
         fVar148 * (fVar230 * auVar277._16_4_ + fVar148 * (float)local_408._0_4_) +
         auVar277._16_4_ * fVar311;
    auVar167._20_4_ =
         fVar172 * (fVar231 * auVar277._20_4_ + fVar172 * (float)local_408._4_4_) +
         auVar277._20_4_ * fVar313;
    auVar167._24_4_ =
         fVar174 * (fVar232 * auVar277._24_4_ + fVar174 * fStack_400) + auVar277._24_4_ * fVar315;
    auVar167._28_4_ = fVar323 + 1.0 + fVar199;
    auVar192._0_4_ =
         fVar71 * fVar217 + auVar277._0_4_ * (auVar137._0_4_ * auVar277._0_4_ + fVar71 * fVar95);
    auVar192._4_4_ =
         fVar171 * fVar176 + auVar277._4_4_ * (auVar137._4_4_ * auVar277._4_4_ + fVar171 * fVar147);
    auVar192._8_4_ =
         fVar195 * fVar196 + auVar277._8_4_ * (auVar137._8_4_ * auVar277._8_4_ + fVar195 * fVar175);
    auVar192._12_4_ =
         fVar215 * fVar200 +
         auVar277._12_4_ * (auVar137._12_4_ * auVar277._12_4_ + fVar215 * fVar197);
    auVar192._16_4_ =
         fVar148 * fVar299 + auVar277._16_4_ * (auVar137._0_4_ * auVar277._16_4_ + fVar148 * fVar95)
    ;
    auVar192._20_4_ =
         fVar172 * fVar300 +
         auVar277._20_4_ * (auVar137._4_4_ * auVar277._20_4_ + fVar172 * fVar147);
    auVar192._24_4_ =
         fVar174 * fVar301 +
         auVar277._24_4_ * (auVar137._8_4_ * auVar277._24_4_ + fVar174 * fVar175);
    auVar192._28_4_ = fVar199 + fVar201;
    auVar290._0_4_ =
         fVar71 * fVar302 + auVar277._0_4_ * (auVar15._0_4_ * auVar277._0_4_ + fVar71 * fVar96);
    auVar290._4_4_ =
         fVar171 * fVar308 + auVar277._4_4_ * (auVar15._4_4_ * auVar277._4_4_ + fVar171 * fVar173);
    auVar290._8_4_ =
         fVar195 * fVar309 + auVar277._8_4_ * (auVar15._8_4_ * auVar277._8_4_ + fVar195 * fVar177);
    auVar290._12_4_ =
         fVar215 * fVar310 +
         auVar277._12_4_ * (auVar15._12_4_ * auVar277._12_4_ + fVar215 * fVar199);
    auVar290._16_4_ =
         fVar148 * fVar311 + auVar277._16_4_ * (auVar15._0_4_ * auVar277._16_4_ + fVar148 * fVar96);
    auVar290._20_4_ =
         fVar172 * fVar313 + auVar277._20_4_ * (auVar15._4_4_ * auVar277._20_4_ + fVar172 * fVar173)
    ;
    auVar290._24_4_ =
         fVar174 * fVar315 + auVar277._24_4_ * (auVar15._8_4_ * auVar277._24_4_ + fVar174 * fVar177)
    ;
    auVar290._28_4_ = fVar201 + fVar199 + 0.0;
    local_78._0_4_ = fVar71 * auVar93._0_4_ + auVar277._0_4_ * auVar192._0_4_;
    local_78._4_4_ = fVar171 * auVar93._4_4_ + auVar277._4_4_ * auVar192._4_4_;
    local_78._8_4_ = fVar195 * auVar93._8_4_ + auVar277._8_4_ * auVar192._8_4_;
    local_78._12_4_ = fVar215 * auVar93._12_4_ + auVar277._12_4_ * auVar192._12_4_;
    local_78._16_4_ = fVar148 * auVar93._16_4_ + auVar277._16_4_ * auVar192._16_4_;
    local_78._20_4_ = fVar172 * auVar93._20_4_ + auVar277._20_4_ * auVar192._20_4_;
    local_78._24_4_ = fVar174 * auVar93._24_4_ + auVar277._24_4_ * auVar192._24_4_;
    local_78._28_4_ = fVar323 + fVar198 + fVar199 + 0.0;
    local_98._0_4_ = fVar71 * auVar167._0_4_ + auVar277._0_4_ * auVar290._0_4_;
    local_98._4_4_ = fVar171 * auVar167._4_4_ + auVar277._4_4_ * auVar290._4_4_;
    local_98._8_4_ = fVar195 * auVar167._8_4_ + auVar277._8_4_ * auVar290._8_4_;
    local_98._12_4_ = fVar215 * auVar167._12_4_ + auVar277._12_4_ * auVar290._12_4_;
    local_98._16_4_ = fVar148 * auVar167._16_4_ + auVar277._16_4_ * auVar290._16_4_;
    local_98._20_4_ = fVar172 * auVar167._20_4_ + auVar277._20_4_ * auVar290._20_4_;
    local_98._24_4_ = fVar174 * auVar167._24_4_ + auVar277._24_4_ * auVar290._24_4_;
    local_98._28_4_ = fVar323 + fVar198 + fVar201;
    auVar20 = vsubps_avx(auVar192,auVar93);
    auVar91 = vsubps_avx(auVar290,auVar167);
    local_448._0_4_ = auVar113._0_4_;
    local_448._4_4_ = auVar113._4_4_;
    fStack_440 = auVar113._8_4_;
    fStack_43c = auVar113._12_4_;
    local_d8 = (float)local_448._0_4_ * auVar20._0_4_ * 3.0;
    fStack_d4 = (float)local_448._4_4_ * auVar20._4_4_ * 3.0;
    auVar21._4_4_ = fStack_d4;
    auVar21._0_4_ = local_d8;
    fStack_d0 = fStack_440 * auVar20._8_4_ * 3.0;
    auVar21._8_4_ = fStack_d0;
    fStack_cc = fStack_43c * auVar20._12_4_ * 3.0;
    auVar21._12_4_ = fStack_cc;
    fStack_c8 = (float)local_448._0_4_ * auVar20._16_4_ * 3.0;
    auVar21._16_4_ = fStack_c8;
    fStack_c4 = (float)local_448._4_4_ * auVar20._20_4_ * 3.0;
    auVar21._20_4_ = fStack_c4;
    fStack_c0 = fStack_440 * auVar20._24_4_ * 3.0;
    auVar21._24_4_ = fStack_c0;
    auVar21._28_4_ = auVar20._28_4_;
    fVar176 = (float)local_448._0_4_ * auVar91._0_4_ * 3.0;
    fVar178 = (float)local_448._4_4_ * auVar91._4_4_ * 3.0;
    auVar22._4_4_ = fVar178;
    auVar22._0_4_ = fVar176;
    fVar196 = fStack_440 * auVar91._8_4_ * 3.0;
    auVar22._8_4_ = fVar196;
    fVar198 = fStack_43c * auVar91._12_4_ * 3.0;
    auVar22._12_4_ = fVar198;
    fVar200 = (float)local_448._0_4_ * auVar91._16_4_ * 3.0;
    auVar22._16_4_ = fVar200;
    fVar299 = (float)local_448._4_4_ * auVar91._20_4_ * 3.0;
    auVar22._20_4_ = fVar299;
    fVar300 = fStack_440 * auVar91._24_4_ * 3.0;
    auVar22._24_4_ = fVar300;
    auVar22._28_4_ = auVar192._28_4_;
    auVar21 = vsubps_avx(local_78,auVar21);
    auVar91 = vperm2f128_avx(auVar21,auVar21,1);
    auVar91 = vshufps_avx(auVar91,auVar21,0x30);
    _local_408 = vshufps_avx(auVar21,auVar91,0x29);
    auVar21 = vsubps_avx(local_98,auVar22);
    auVar91 = vperm2f128_avx(auVar21,auVar21,1);
    auVar91 = vshufps_avx(auVar91,auVar21,0x30);
    _local_3e8 = vshufps_avx(auVar21,auVar91,0x29);
    fVar325 = auVar133._0_4_;
    fVar330 = auVar133._4_4_;
    fVar331 = auVar133._8_4_;
    fVar95 = auVar112._0_4_;
    fVar173 = auVar112._4_4_;
    fVar197 = auVar112._8_4_;
    fVar216 = auVar112._12_4_;
    fVar324 = auVar213._12_4_;
    auVar113 = vshufps_avx(auVar241,auVar241,0xaa);
    fVar96 = auVar113._0_4_;
    fVar175 = auVar113._4_4_;
    fVar199 = auVar113._8_4_;
    fVar217 = auVar113._12_4_;
    fVar310 = auVar277._0_4_ * fVar96 + fVar325 * fVar71;
    fVar311 = auVar277._4_4_ * fVar175 + fVar330 * fVar171;
    fVar313 = auVar277._8_4_ * fVar199 + fVar331 * fVar195;
    fVar315 = auVar277._12_4_ * fVar217 + auVar133._12_4_ * fVar215;
    fVar312 = auVar277._16_4_ * fVar96 + fVar325 * fVar148;
    fVar314 = auVar277._20_4_ * fVar175 + fVar330 * fVar172;
    fVar316 = auVar277._24_4_ * fVar199 + fVar331 * fVar174;
    fVar317 = fVar324 + fVar323 + fVar317;
    auVar113 = vshufps_avx(auVar241,auVar241,0xff);
    fVar147 = auVar113._0_4_;
    fVar177 = auVar113._4_4_;
    fVar201 = auVar113._8_4_;
    fVar298 = auVar113._12_4_;
    fVar301 = auVar277._0_4_ * fVar147 + fVar71 * fVar95;
    fVar230 = auVar277._4_4_ * fVar177 + fVar171 * fVar173;
    fVar302 = auVar277._8_4_ * fVar201 + fVar195 * fVar197;
    fVar231 = auVar277._12_4_ * fVar298 + fVar215 * fVar216;
    fVar308 = auVar277._16_4_ * fVar147 + fVar148 * fVar95;
    fVar232 = auVar277._20_4_ * fVar177 + fVar172 * fVar173;
    fVar309 = auVar277._24_4_ * fVar201 + fVar174 * fVar197;
    auVar113 = vshufps_avx(auVar157,auVar157,0xaa);
    auVar14 = vshufps_avx(auVar157,auVar157,0xff);
    fVar323 = auVar14._12_4_;
    auVar94._0_4_ =
         auVar277._0_4_ * fVar310 + fVar71 * (fVar325 * auVar277._0_4_ + auVar283._0_4_ * fVar71);
    auVar94._4_4_ =
         auVar277._4_4_ * fVar311 + fVar171 * (fVar330 * auVar277._4_4_ + auVar283._4_4_ * fVar171);
    auVar94._8_4_ =
         auVar277._8_4_ * fVar313 + fVar195 * (fVar331 * auVar277._8_4_ + auVar283._8_4_ * fVar195);
    auVar94._12_4_ =
         auVar277._12_4_ * fVar315 +
         fVar215 * (auVar133._12_4_ * auVar277._12_4_ + auVar283._12_4_ * fVar215);
    auVar94._16_4_ =
         auVar277._16_4_ * fVar312 +
         fVar148 * (fVar325 * auVar277._16_4_ + auVar283._0_4_ * fVar148);
    auVar94._20_4_ =
         auVar277._20_4_ * fVar314 +
         fVar172 * (fVar330 * auVar277._20_4_ + auVar283._4_4_ * fVar172);
    auVar94._24_4_ =
         auVar277._24_4_ * fVar316 +
         fVar174 * (fVar331 * auVar277._24_4_ + auVar283._8_4_ * fVar174);
    auVar94._28_4_ = fVar323 + auVar21._28_4_ + auVar91._28_4_;
    auVar322._0_4_ =
         auVar277._0_4_ * fVar301 + fVar71 * (auVar277._0_4_ * fVar95 + auVar213._0_4_ * fVar71);
    auVar322._4_4_ =
         auVar277._4_4_ * fVar230 + fVar171 * (auVar277._4_4_ * fVar173 + auVar213._4_4_ * fVar171);
    auVar322._8_4_ =
         auVar277._8_4_ * fVar302 + fVar195 * (auVar277._8_4_ * fVar197 + auVar213._8_4_ * fVar195);
    auVar322._12_4_ =
         auVar277._12_4_ * fVar231 + fVar215 * (auVar277._12_4_ * fVar216 + fVar324 * fVar215);
    auVar322._16_4_ =
         auVar277._16_4_ * fVar308 + fVar148 * (auVar277._16_4_ * fVar95 + auVar213._0_4_ * fVar148)
    ;
    auVar322._20_4_ =
         auVar277._20_4_ * fVar232 +
         fVar172 * (auVar277._20_4_ * fVar173 + auVar213._4_4_ * fVar172);
    auVar322._24_4_ =
         auVar277._24_4_ * fVar309 +
         fVar174 * (auVar277._24_4_ * fVar197 + auVar213._8_4_ * fVar174);
    auVar322._28_4_ = fVar323 + auVar91._28_4_ + auVar192._28_4_;
    auVar91 = vperm2f128_avx(local_78,local_78,1);
    auVar91 = vshufps_avx(auVar91,local_78,0x30);
    _local_3a8 = vshufps_avx(local_78,auVar91,0x29);
    auVar193._0_4_ =
         fVar71 * fVar310 + auVar277._0_4_ * (auVar113._0_4_ * auVar277._0_4_ + fVar71 * fVar96);
    auVar193._4_4_ =
         fVar171 * fVar311 + auVar277._4_4_ * (auVar113._4_4_ * auVar277._4_4_ + fVar171 * fVar175);
    auVar193._8_4_ =
         fVar195 * fVar313 + auVar277._8_4_ * (auVar113._8_4_ * auVar277._8_4_ + fVar195 * fVar199);
    auVar193._12_4_ =
         fVar215 * fVar315 +
         auVar277._12_4_ * (auVar113._12_4_ * auVar277._12_4_ + fVar215 * fVar217);
    auVar193._16_4_ =
         fVar148 * fVar312 + auVar277._16_4_ * (auVar113._0_4_ * auVar277._16_4_ + fVar148 * fVar96)
    ;
    auVar193._20_4_ =
         fVar172 * fVar314 +
         auVar277._20_4_ * (auVar113._4_4_ * auVar277._20_4_ + fVar172 * fVar175);
    auVar193._24_4_ =
         fVar174 * fVar316 +
         auVar277._24_4_ * (auVar113._8_4_ * auVar277._24_4_ + fVar174 * fVar199);
    auVar193._28_4_ = fVar317 + auVar113._12_4_ + fVar217;
    auVar229._0_4_ =
         fVar71 * fVar301 + auVar277._0_4_ * (auVar14._0_4_ * auVar277._0_4_ + fVar71 * fVar147);
    auVar229._4_4_ =
         fVar171 * fVar230 + auVar277._4_4_ * (auVar14._4_4_ * auVar277._4_4_ + fVar171 * fVar177);
    auVar229._8_4_ =
         fVar195 * fVar302 + auVar277._8_4_ * (auVar14._8_4_ * auVar277._8_4_ + fVar195 * fVar201);
    auVar229._12_4_ =
         fVar215 * fVar231 + auVar277._12_4_ * (fVar323 * auVar277._12_4_ + fVar215 * fVar298);
    auVar229._16_4_ =
         fVar148 * fVar308 + auVar277._16_4_ * (auVar14._0_4_ * auVar277._16_4_ + fVar148 * fVar147)
    ;
    auVar229._20_4_ =
         fVar172 * fVar232 + auVar277._20_4_ * (auVar14._4_4_ * auVar277._20_4_ + fVar172 * fVar177)
    ;
    auVar229._24_4_ =
         fVar174 * fVar309 + auVar277._24_4_ * (auVar14._8_4_ * auVar277._24_4_ + fVar174 * fVar201)
    ;
    auVar229._28_4_ = fVar324 + fVar216 + fVar323 + fVar298;
    auVar245._0_4_ = fVar71 * auVar94._0_4_ + auVar277._0_4_ * auVar193._0_4_;
    auVar245._4_4_ = fVar171 * auVar94._4_4_ + auVar277._4_4_ * auVar193._4_4_;
    auVar245._8_4_ = fVar195 * auVar94._8_4_ + auVar277._8_4_ * auVar193._8_4_;
    auVar245._12_4_ = fVar215 * auVar94._12_4_ + auVar277._12_4_ * auVar193._12_4_;
    auVar245._16_4_ = fVar148 * auVar94._16_4_ + auVar277._16_4_ * auVar193._16_4_;
    auVar245._20_4_ = fVar172 * auVar94._20_4_ + auVar277._20_4_ * auVar193._20_4_;
    auVar245._24_4_ = fVar174 * auVar94._24_4_ + auVar277._24_4_ * auVar193._24_4_;
    auVar245._28_4_ = fVar317 + fVar323 + fVar298;
    auVar265._0_4_ = fVar71 * auVar322._0_4_ + auVar277._0_4_ * auVar229._0_4_;
    auVar265._4_4_ = fVar171 * auVar322._4_4_ + auVar277._4_4_ * auVar229._4_4_;
    auVar265._8_4_ = fVar195 * auVar322._8_4_ + auVar277._8_4_ * auVar229._8_4_;
    auVar265._12_4_ = fVar215 * auVar322._12_4_ + auVar277._12_4_ * auVar229._12_4_;
    auVar265._16_4_ = fVar148 * auVar322._16_4_ + auVar277._16_4_ * auVar229._16_4_;
    auVar265._20_4_ = fVar172 * auVar322._20_4_ + auVar277._20_4_ * auVar229._20_4_;
    auVar265._24_4_ = fVar174 * auVar322._24_4_ + auVar277._24_4_ * auVar229._24_4_;
    auVar265._28_4_ = auVar19._28_4_ + auVar277._28_4_;
    auVar91 = vsubps_avx(auVar193,auVar94);
    auVar19 = vsubps_avx(auVar229,auVar322);
    local_f8 = (float)local_448._0_4_ * auVar91._0_4_ * 3.0;
    fStack_f4 = (float)local_448._4_4_ * auVar91._4_4_ * 3.0;
    auVar17._4_4_ = fStack_f4;
    auVar17._0_4_ = local_f8;
    fStack_f0 = fStack_440 * auVar91._8_4_ * 3.0;
    auVar17._8_4_ = fStack_f0;
    fStack_ec = fStack_43c * auVar91._12_4_ * 3.0;
    auVar17._12_4_ = fStack_ec;
    fStack_e8 = (float)local_448._0_4_ * auVar91._16_4_ * 3.0;
    auVar17._16_4_ = fStack_e8;
    fStack_e4 = (float)local_448._4_4_ * auVar91._20_4_ * 3.0;
    auVar17._20_4_ = fStack_e4;
    fStack_e0 = fStack_440 * auVar91._24_4_ * 3.0;
    auVar17._24_4_ = fStack_e0;
    auVar17._28_4_ = auVar229._28_4_;
    local_118 = (float)local_448._0_4_ * auVar19._0_4_ * 3.0;
    fStack_114 = (float)local_448._4_4_ * auVar19._4_4_ * 3.0;
    auVar18._4_4_ = fStack_114;
    auVar18._0_4_ = local_118;
    fStack_110 = fStack_440 * auVar19._8_4_ * 3.0;
    auVar18._8_4_ = fStack_110;
    fStack_10c = fStack_43c * auVar19._12_4_ * 3.0;
    auVar18._12_4_ = fStack_10c;
    local_448._0_4_ = (float)local_448._0_4_ * auVar19._16_4_ * 3.0;
    auVar18._16_4_ = local_448._0_4_;
    local_448._4_4_ = (float)local_448._4_4_ * auVar19._20_4_ * 3.0;
    auVar18._20_4_ = local_448._4_4_;
    fStack_440 = fStack_440 * auVar19._24_4_ * 3.0;
    auVar18._24_4_ = fStack_440;
    auVar18._28_4_ = fStack_43c;
    auVar91 = vperm2f128_avx(auVar245,auVar245,1);
    auVar91 = vshufps_avx(auVar91,auVar245,0x30);
    auVar92 = vshufps_avx(auVar245,auVar91,0x29);
    auVar19 = vsubps_avx(auVar245,auVar17);
    auVar91 = vperm2f128_avx(auVar19,auVar19,1);
    auVar91 = vshufps_avx(auVar91,auVar19,0x30);
    auVar17 = vshufps_avx(auVar19,auVar91,0x29);
    auVar19 = vsubps_avx(auVar265,auVar18);
    auVar91 = vperm2f128_avx(auVar19,auVar19,1);
    auVar91 = vshufps_avx(auVar91,auVar19,0x30);
    auVar18 = vshufps_avx(auVar19,auVar91,0x29);
    auVar21 = vsubps_avx(auVar245,local_78);
    auVar22 = vsubps_avx(auVar92,_local_3a8);
    fVar71 = auVar22._0_4_ + auVar21._0_4_;
    fVar95 = auVar22._4_4_ + auVar21._4_4_;
    fVar96 = auVar22._8_4_ + auVar21._8_4_;
    fVar147 = auVar22._12_4_ + auVar21._12_4_;
    fVar171 = auVar22._16_4_ + auVar21._16_4_;
    fVar173 = auVar22._20_4_ + auVar21._20_4_;
    fVar175 = auVar22._24_4_ + auVar21._24_4_;
    auVar19 = vperm2f128_avx(local_98,local_98,1);
    auVar19 = vshufps_avx(auVar19,local_98,0x30);
    local_b8 = vshufps_avx(local_98,auVar19,0x29);
    auVar19 = vperm2f128_avx(auVar265,auVar265,1);
    auVar19 = vshufps_avx(auVar19,auVar265,0x30);
    auVar93 = vshufps_avx(auVar265,auVar19,0x29);
    auVar19 = vsubps_avx(auVar265,local_98);
    auVar94 = vsubps_avx(auVar93,local_b8);
    fVar177 = auVar19._0_4_ + auVar94._0_4_;
    fVar195 = auVar19._4_4_ + auVar94._4_4_;
    fVar197 = auVar19._8_4_ + auVar94._8_4_;
    fVar199 = auVar19._12_4_ + auVar94._12_4_;
    fVar201 = auVar19._16_4_ + auVar94._16_4_;
    fVar215 = auVar19._20_4_ + auVar94._20_4_;
    fVar216 = auVar19._24_4_ + auVar94._24_4_;
    fVar217 = auVar19._28_4_;
    auVar19._4_4_ = local_98._4_4_ * fVar95;
    auVar19._0_4_ = local_98._0_4_ * fVar71;
    auVar19._8_4_ = local_98._8_4_ * fVar96;
    auVar19._12_4_ = local_98._12_4_ * fVar147;
    auVar19._16_4_ = local_98._16_4_ * fVar171;
    auVar19._20_4_ = local_98._20_4_ * fVar173;
    auVar19._24_4_ = local_98._24_4_ * fVar175;
    auVar19._28_4_ = fVar217;
    auVar23._4_4_ = fVar195 * local_78._4_4_;
    auVar23._0_4_ = fVar177 * local_78._0_4_;
    auVar23._8_4_ = fVar197 * local_78._8_4_;
    auVar23._12_4_ = fVar199 * local_78._12_4_;
    auVar23._16_4_ = fVar201 * local_78._16_4_;
    auVar23._20_4_ = fVar215 * local_78._20_4_;
    auVar23._24_4_ = fVar216 * local_78._24_4_;
    auVar23._28_4_ = auVar91._28_4_;
    auVar91 = vsubps_avx(auVar19,auVar23);
    local_d8 = local_78._0_4_ + local_d8;
    fStack_d4 = local_78._4_4_ + fStack_d4;
    fStack_d0 = local_78._8_4_ + fStack_d0;
    fStack_cc = local_78._12_4_ + fStack_cc;
    fStack_c8 = local_78._16_4_ + fStack_c8;
    fStack_c4 = local_78._20_4_ + fStack_c4;
    fStack_c0 = local_78._24_4_ + fStack_c0;
    fStack_bc = local_78._28_4_ + auVar20._28_4_;
    fVar176 = local_98._0_4_ + fVar176;
    fVar178 = local_98._4_4_ + fVar178;
    fVar196 = local_98._8_4_ + fVar196;
    fVar198 = local_98._12_4_ + fVar198;
    fVar200 = local_98._16_4_ + fVar200;
    fVar299 = local_98._20_4_ + fVar299;
    fVar300 = local_98._24_4_ + fVar300;
    auVar20._4_4_ = fVar178 * fVar95;
    auVar20._0_4_ = fVar176 * fVar71;
    auVar20._8_4_ = fVar196 * fVar96;
    auVar20._12_4_ = fVar198 * fVar147;
    auVar20._16_4_ = fVar200 * fVar171;
    auVar20._20_4_ = fVar299 * fVar173;
    auVar20._24_4_ = fVar300 * fVar175;
    auVar20._28_4_ = fVar217;
    auVar24._4_4_ = fVar195 * fStack_d4;
    auVar24._0_4_ = fVar177 * local_d8;
    auVar24._8_4_ = fVar197 * fStack_d0;
    auVar24._12_4_ = fVar199 * fStack_cc;
    auVar24._16_4_ = fVar201 * fStack_c8;
    auVar24._20_4_ = fVar215 * fStack_c4;
    auVar24._24_4_ = fVar216 * fStack_c0;
    auVar24._28_4_ = fStack_bc;
    auVar20 = vsubps_avx(auVar20,auVar24);
    auVar25._4_4_ = local_3e8._4_4_ * fVar95;
    auVar25._0_4_ = local_3e8._0_4_ * fVar71;
    auVar25._8_4_ = local_3e8._8_4_ * fVar96;
    auVar25._12_4_ = local_3e8._12_4_ * fVar147;
    auVar25._16_4_ = local_3e8._16_4_ * fVar171;
    auVar25._20_4_ = local_3e8._20_4_ * fVar173;
    auVar25._24_4_ = local_3e8._24_4_ * fVar175;
    auVar25._28_4_ = fVar217;
    auVar26._4_4_ = fVar195 * (float)local_408._4_4_;
    auVar26._0_4_ = fVar177 * (float)local_408._0_4_;
    auVar26._8_4_ = fVar197 * fStack_400;
    auVar26._12_4_ = fVar199 * fStack_3fc;
    auVar26._16_4_ = fVar201 * fStack_3f8;
    auVar26._20_4_ = fVar215 * fStack_3f4;
    auVar26._24_4_ = fVar216 * fStack_3f0;
    auVar26._28_4_ = 0x40400000;
    auVar23 = vsubps_avx(auVar25,auVar26);
    auVar27._4_4_ = local_b8._4_4_ * fVar95;
    auVar27._0_4_ = local_b8._0_4_ * fVar71;
    auVar27._8_4_ = local_b8._8_4_ * fVar96;
    auVar27._12_4_ = local_b8._12_4_ * fVar147;
    auVar27._16_4_ = local_b8._16_4_ * fVar171;
    auVar27._20_4_ = local_b8._20_4_ * fVar173;
    auVar27._24_4_ = local_b8._24_4_ * fVar175;
    auVar27._28_4_ = fVar217;
    auVar28._4_4_ = local_3a8._4_4_ * fVar195;
    auVar28._0_4_ = local_3a8._0_4_ * fVar177;
    auVar28._8_4_ = local_3a8._8_4_ * fVar197;
    auVar28._12_4_ = local_3a8._12_4_ * fVar199;
    auVar28._16_4_ = local_3a8._16_4_ * fVar201;
    auVar28._20_4_ = local_3a8._20_4_ * fVar215;
    auVar28._24_4_ = local_3a8._24_4_ * fVar216;
    auVar28._28_4_ = local_b8._28_4_;
    auVar24 = vsubps_avx(auVar27,auVar28);
    auVar29._4_4_ = auVar265._4_4_ * fVar95;
    auVar29._0_4_ = auVar265._0_4_ * fVar71;
    auVar29._8_4_ = auVar265._8_4_ * fVar96;
    auVar29._12_4_ = auVar265._12_4_ * fVar147;
    auVar29._16_4_ = auVar265._16_4_ * fVar171;
    auVar29._20_4_ = auVar265._20_4_ * fVar173;
    auVar29._24_4_ = auVar265._24_4_ * fVar175;
    auVar29._28_4_ = fVar217;
    auVar30._4_4_ = fVar195 * auVar245._4_4_;
    auVar30._0_4_ = fVar177 * auVar245._0_4_;
    auVar30._8_4_ = fVar197 * auVar245._8_4_;
    auVar30._12_4_ = fVar199 * auVar245._12_4_;
    auVar30._16_4_ = fVar201 * auVar245._16_4_;
    auVar30._20_4_ = fVar215 * auVar245._20_4_;
    auVar30._24_4_ = fVar216 * auVar245._24_4_;
    auVar30._28_4_ = local_3e8._28_4_;
    auVar25 = vsubps_avx(auVar29,auVar30);
    local_f8 = auVar245._0_4_ + local_f8;
    fStack_f4 = auVar245._4_4_ + fStack_f4;
    fStack_f0 = auVar245._8_4_ + fStack_f0;
    fStack_ec = auVar245._12_4_ + fStack_ec;
    fStack_e8 = auVar245._16_4_ + fStack_e8;
    fStack_e4 = auVar245._20_4_ + fStack_e4;
    fStack_e0 = auVar245._24_4_ + fStack_e0;
    fStack_dc = auVar245._28_4_ + auVar229._28_4_;
    local_118 = auVar265._0_4_ + local_118;
    fStack_114 = auVar265._4_4_ + fStack_114;
    fStack_110 = auVar265._8_4_ + fStack_110;
    fStack_10c = auVar265._12_4_ + fStack_10c;
    fStack_108 = auVar265._16_4_ + (float)local_448._0_4_;
    fStack_104 = auVar265._20_4_ + (float)local_448._4_4_;
    fStack_100 = auVar265._24_4_ + fStack_440;
    fStack_fc = auVar265._28_4_ + fStack_43c;
    auVar31._4_4_ = fStack_114 * fVar95;
    auVar31._0_4_ = local_118 * fVar71;
    auVar31._8_4_ = fStack_110 * fVar96;
    auVar31._12_4_ = fStack_10c * fVar147;
    auVar31._16_4_ = fStack_108 * fVar171;
    auVar31._20_4_ = fStack_104 * fVar173;
    auVar31._24_4_ = fStack_100 * fVar175;
    auVar31._28_4_ = auVar265._28_4_ + fStack_43c;
    auVar32._4_4_ = fStack_f4 * fVar195;
    auVar32._0_4_ = local_f8 * fVar177;
    auVar32._8_4_ = fStack_f0 * fVar197;
    auVar32._12_4_ = fStack_ec * fVar199;
    auVar32._16_4_ = fStack_e8 * fVar201;
    auVar32._20_4_ = fStack_e4 * fVar215;
    auVar32._24_4_ = fStack_e0 * fVar216;
    auVar32._28_4_ = fStack_dc;
    auVar26 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = auVar18._4_4_ * fVar95;
    auVar33._0_4_ = auVar18._0_4_ * fVar71;
    auVar33._8_4_ = auVar18._8_4_ * fVar96;
    auVar33._12_4_ = auVar18._12_4_ * fVar147;
    auVar33._16_4_ = auVar18._16_4_ * fVar171;
    auVar33._20_4_ = auVar18._20_4_ * fVar173;
    auVar33._24_4_ = auVar18._24_4_ * fVar175;
    auVar33._28_4_ = fStack_dc;
    auVar34._4_4_ = fVar195 * auVar17._4_4_;
    auVar34._0_4_ = fVar177 * auVar17._0_4_;
    auVar34._8_4_ = fVar197 * auVar17._8_4_;
    auVar34._12_4_ = fVar199 * auVar17._12_4_;
    auVar34._16_4_ = fVar201 * auVar17._16_4_;
    auVar34._20_4_ = fVar215 * auVar17._20_4_;
    auVar34._24_4_ = fVar216 * auVar17._24_4_;
    auVar34._28_4_ = auVar17._28_4_;
    auVar27 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = auVar93._4_4_ * fVar95;
    auVar35._0_4_ = auVar93._0_4_ * fVar71;
    auVar35._8_4_ = auVar93._8_4_ * fVar96;
    auVar35._12_4_ = auVar93._12_4_ * fVar147;
    auVar35._16_4_ = auVar93._16_4_ * fVar171;
    auVar35._20_4_ = auVar93._20_4_ * fVar173;
    auVar35._24_4_ = auVar93._24_4_ * fVar175;
    auVar35._28_4_ = auVar22._28_4_ + auVar21._28_4_;
    auVar36._4_4_ = auVar92._4_4_ * fVar195;
    auVar36._0_4_ = auVar92._0_4_ * fVar177;
    auVar36._8_4_ = auVar92._8_4_ * fVar197;
    auVar36._12_4_ = auVar92._12_4_ * fVar199;
    auVar36._16_4_ = auVar92._16_4_ * fVar201;
    auVar36._20_4_ = auVar92._20_4_ * fVar215;
    auVar36._24_4_ = auVar92._24_4_ * fVar216;
    auVar36._28_4_ = fVar217 + auVar94._28_4_;
    auVar94 = vsubps_avx(auVar35,auVar36);
    auVar19 = vminps_avx(auVar91,auVar20);
    auVar91 = vmaxps_avx(auVar91,auVar20);
    auVar20 = vminps_avx(auVar23,auVar24);
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar23,auVar24);
    auVar91 = vmaxps_avx(auVar91,auVar19);
    auVar21 = vminps_avx(auVar25,auVar26);
    auVar19 = vmaxps_avx(auVar25,auVar26);
    auVar22 = vminps_avx(auVar27,auVar94);
    auVar21 = vminps_avx(auVar21,auVar22);
    auVar21 = vminps_avx(auVar20,auVar21);
    auVar20 = vmaxps_avx(auVar27,auVar94);
    auVar19 = vmaxps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar91,auVar19);
    auVar91 = vcmpps_avx(auVar21,local_138,2);
    auVar19 = vcmpps_avx(auVar19,local_158,5);
    auVar91 = vandps_avx(auVar19,auVar91);
    auVar19 = local_198 & auVar91;
    uVar62 = 0;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0x7f,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0xbf,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0')
    {
      auVar19 = vsubps_avx(_local_3a8,local_78);
      auVar20 = vsubps_avx(auVar92,auVar245);
      fVar95 = auVar19._0_4_ + auVar20._0_4_;
      fVar96 = auVar19._4_4_ + auVar20._4_4_;
      fVar147 = auVar19._8_4_ + auVar20._8_4_;
      fVar171 = auVar19._12_4_ + auVar20._12_4_;
      fVar173 = auVar19._16_4_ + auVar20._16_4_;
      fVar175 = auVar19._20_4_ + auVar20._20_4_;
      fVar177 = auVar19._24_4_ + auVar20._24_4_;
      auVar21 = vsubps_avx(local_b8,local_98);
      auVar22 = vsubps_avx(auVar93,auVar265);
      fVar195 = auVar21._0_4_ + auVar22._0_4_;
      fVar197 = auVar21._4_4_ + auVar22._4_4_;
      fVar199 = auVar21._8_4_ + auVar22._8_4_;
      fVar201 = auVar21._12_4_ + auVar22._12_4_;
      fVar215 = auVar21._16_4_ + auVar22._16_4_;
      fVar216 = auVar21._20_4_ + auVar22._20_4_;
      fVar217 = auVar21._24_4_ + auVar22._24_4_;
      fVar71 = auVar22._28_4_;
      auVar37._4_4_ = local_98._4_4_ * fVar96;
      auVar37._0_4_ = local_98._0_4_ * fVar95;
      auVar37._8_4_ = local_98._8_4_ * fVar147;
      auVar37._12_4_ = local_98._12_4_ * fVar171;
      auVar37._16_4_ = local_98._16_4_ * fVar173;
      auVar37._20_4_ = local_98._20_4_ * fVar175;
      auVar37._24_4_ = local_98._24_4_ * fVar177;
      auVar37._28_4_ = local_98._28_4_;
      auVar38._4_4_ = local_78._4_4_ * fVar197;
      auVar38._0_4_ = local_78._0_4_ * fVar195;
      auVar38._8_4_ = local_78._8_4_ * fVar199;
      auVar38._12_4_ = local_78._12_4_ * fVar201;
      auVar38._16_4_ = local_78._16_4_ * fVar215;
      auVar38._20_4_ = local_78._20_4_ * fVar216;
      auVar38._24_4_ = local_78._24_4_ * fVar217;
      auVar38._28_4_ = local_78._28_4_;
      auVar22 = vsubps_avx(auVar37,auVar38);
      auVar39._4_4_ = fVar178 * fVar96;
      auVar39._0_4_ = fVar176 * fVar95;
      auVar39._8_4_ = fVar196 * fVar147;
      auVar39._12_4_ = fVar198 * fVar171;
      auVar39._16_4_ = fVar200 * fVar173;
      auVar39._20_4_ = fVar299 * fVar175;
      auVar39._24_4_ = fVar300 * fVar177;
      auVar39._28_4_ = local_98._28_4_;
      auVar40._4_4_ = fVar197 * fStack_d4;
      auVar40._0_4_ = fVar195 * local_d8;
      auVar40._8_4_ = fVar199 * fStack_d0;
      auVar40._12_4_ = fVar201 * fStack_cc;
      auVar40._16_4_ = fVar215 * fStack_c8;
      auVar40._20_4_ = fVar216 * fStack_c4;
      auVar40._24_4_ = fVar217 * fStack_c0;
      auVar40._28_4_ = fVar71;
      auVar94 = vsubps_avx(auVar39,auVar40);
      auVar41._4_4_ = fVar96 * local_3e8._4_4_;
      auVar41._0_4_ = fVar95 * local_3e8._0_4_;
      auVar41._8_4_ = fVar147 * local_3e8._8_4_;
      auVar41._12_4_ = fVar171 * local_3e8._12_4_;
      auVar41._16_4_ = fVar173 * local_3e8._16_4_;
      auVar41._20_4_ = fVar175 * local_3e8._20_4_;
      auVar41._24_4_ = fVar177 * local_3e8._24_4_;
      auVar41._28_4_ = fVar71;
      auVar42._4_4_ = fVar197 * (float)local_408._4_4_;
      auVar42._0_4_ = fVar195 * (float)local_408._0_4_;
      auVar42._8_4_ = fVar199 * fStack_400;
      auVar42._12_4_ = fVar201 * fStack_3fc;
      auVar42._16_4_ = fVar215 * fStack_3f8;
      auVar42._20_4_ = fVar216 * fStack_3f4;
      auVar42._24_4_ = fVar217 * fStack_3f0;
      auVar42._28_4_ = local_98._28_4_ + auVar192._28_4_;
      auVar23 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = local_b8._4_4_ * fVar96;
      auVar43._0_4_ = local_b8._0_4_ * fVar95;
      auVar43._8_4_ = local_b8._8_4_ * fVar147;
      auVar43._12_4_ = local_b8._12_4_ * fVar171;
      auVar43._16_4_ = local_b8._16_4_ * fVar173;
      auVar43._20_4_ = local_b8._20_4_ * fVar175;
      auVar43._24_4_ = local_b8._24_4_ * fVar177;
      auVar43._28_4_ = local_98._28_4_ + auVar192._28_4_;
      auVar44._4_4_ = local_3a8._4_4_ * fVar197;
      auVar44._0_4_ = local_3a8._0_4_ * fVar195;
      auVar44._8_4_ = local_3a8._8_4_ * fVar199;
      auVar44._12_4_ = local_3a8._12_4_ * fVar201;
      auVar44._16_4_ = local_3a8._16_4_ * fVar215;
      auVar44._20_4_ = local_3a8._20_4_ * fVar216;
      uVar4 = local_3a8._28_4_;
      auVar44._24_4_ = local_3a8._24_4_ * fVar217;
      auVar44._28_4_ = uVar4;
      auVar24 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = auVar265._4_4_ * fVar96;
      auVar45._0_4_ = auVar265._0_4_ * fVar95;
      auVar45._8_4_ = auVar265._8_4_ * fVar147;
      auVar45._12_4_ = auVar265._12_4_ * fVar171;
      auVar45._16_4_ = auVar265._16_4_ * fVar173;
      auVar45._20_4_ = auVar265._20_4_ * fVar175;
      auVar45._24_4_ = auVar265._24_4_ * fVar177;
      auVar45._28_4_ = auVar265._28_4_;
      auVar46._4_4_ = auVar245._4_4_ * fVar197;
      auVar46._0_4_ = auVar245._0_4_ * fVar195;
      auVar46._8_4_ = auVar245._8_4_ * fVar199;
      auVar46._12_4_ = auVar245._12_4_ * fVar201;
      auVar46._16_4_ = auVar245._16_4_ * fVar215;
      auVar46._20_4_ = auVar245._20_4_ * fVar216;
      auVar46._24_4_ = auVar245._24_4_ * fVar217;
      auVar46._28_4_ = auVar245._28_4_;
      auVar25 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar96 * fStack_114;
      auVar47._0_4_ = fVar95 * local_118;
      auVar47._8_4_ = fVar147 * fStack_110;
      auVar47._12_4_ = fVar171 * fStack_10c;
      auVar47._16_4_ = fVar173 * fStack_108;
      auVar47._20_4_ = fVar175 * fStack_104;
      auVar47._24_4_ = fVar177 * fStack_100;
      auVar47._28_4_ = auVar265._28_4_;
      auVar48._4_4_ = fVar197 * fStack_f4;
      auVar48._0_4_ = fVar195 * local_f8;
      auVar48._8_4_ = fVar199 * fStack_f0;
      auVar48._12_4_ = fVar201 * fStack_ec;
      auVar48._16_4_ = fVar215 * fStack_e8;
      auVar48._20_4_ = fVar216 * fStack_e4;
      auVar48._24_4_ = fVar217 * fStack_e0;
      auVar48._28_4_ = uVar4;
      auVar26 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar96 * auVar18._4_4_;
      auVar49._0_4_ = fVar95 * auVar18._0_4_;
      auVar49._8_4_ = fVar147 * auVar18._8_4_;
      auVar49._12_4_ = fVar171 * auVar18._12_4_;
      auVar49._16_4_ = fVar173 * auVar18._16_4_;
      auVar49._20_4_ = fVar175 * auVar18._20_4_;
      auVar49._24_4_ = fVar177 * auVar18._24_4_;
      auVar49._28_4_ = uVar4;
      auVar50._4_4_ = fVar197 * auVar17._4_4_;
      auVar50._0_4_ = fVar195 * auVar17._0_4_;
      auVar50._8_4_ = fVar199 * auVar17._8_4_;
      auVar50._12_4_ = fVar201 * auVar17._12_4_;
      auVar50._16_4_ = fVar215 * auVar17._16_4_;
      auVar50._20_4_ = fVar216 * auVar17._20_4_;
      auVar50._24_4_ = fVar217 * auVar17._24_4_;
      auVar50._28_4_ = local_b8._28_4_;
      auVar17 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = auVar93._4_4_ * fVar96;
      auVar51._0_4_ = auVar93._0_4_ * fVar95;
      auVar51._8_4_ = auVar93._8_4_ * fVar147;
      auVar51._12_4_ = auVar93._12_4_ * fVar171;
      auVar51._16_4_ = auVar93._16_4_ * fVar173;
      auVar51._20_4_ = auVar93._20_4_ * fVar175;
      auVar51._24_4_ = auVar93._24_4_ * fVar177;
      auVar51._28_4_ = auVar19._28_4_ + auVar20._28_4_;
      auVar52._4_4_ = auVar92._4_4_ * fVar197;
      auVar52._0_4_ = auVar92._0_4_ * fVar195;
      auVar52._8_4_ = auVar92._8_4_ * fVar199;
      auVar52._12_4_ = auVar92._12_4_ * fVar201;
      auVar52._16_4_ = auVar92._16_4_ * fVar215;
      auVar52._20_4_ = auVar92._20_4_ * fVar216;
      auVar52._24_4_ = auVar92._24_4_ * fVar217;
      auVar52._28_4_ = auVar21._28_4_ + fVar71;
      auVar93 = vsubps_avx(auVar51,auVar52);
      auVar20 = vminps_avx(auVar22,auVar94);
      auVar19 = vmaxps_avx(auVar22,auVar94);
      auVar21 = vminps_avx(auVar23,auVar24);
      auVar21 = vminps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar23,auVar24);
      auVar19 = vmaxps_avx(auVar19,auVar20);
      auVar22 = vminps_avx(auVar25,auVar26);
      auVar20 = vmaxps_avx(auVar25,auVar26);
      auVar92 = vminps_avx(auVar17,auVar93);
      auVar22 = vminps_avx(auVar22,auVar92);
      auVar22 = vminps_avx(auVar21,auVar22);
      auVar21 = vmaxps_avx(auVar17,auVar93);
      auVar20 = vmaxps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vcmpps_avx(auVar22,local_138,2);
      auVar20 = vcmpps_avx(auVar20,local_158,5);
      auVar19 = vandps_avx(auVar20,auVar19);
      auVar91 = vandps_avx(auVar91,local_198);
      auVar20 = auVar91 & auVar19;
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0x7f,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0xbf,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar20[0x1f] < '\0') {
        auVar91 = vandps_avx(auVar19,auVar91);
        uVar62 = vmovmskps_avx(auVar91);
      }
    }
    _local_448 = auVar18;
    if (uVar62 != 0) {
      auStack_268[uVar64] = uVar62;
      uVar5 = vmovlps_avx(local_1d8);
      *(undefined8 *)(afStack_178 + uVar64 * 2) = uVar5;
      uVar68 = vmovlps_avx(_local_498);
      auStack_58[uVar64] = uVar68;
      uVar64 = (ulong)((int)uVar64 + 1);
    }
    do {
      if ((int)uVar64 == 0) {
        if (bVar59) {
          return local_4d9;
        }
        fVar97 = ray->tfar;
        auVar90._4_4_ = fVar97;
        auVar90._0_4_ = fVar97;
        auVar90._8_4_ = fVar97;
        auVar90._12_4_ = fVar97;
        auVar113 = vcmpps_avx(local_1e8,auVar90,2);
        uVar63 = vmovmskps_avx(auVar113);
        uVar61 = SUB84(auVar70,0) & uVar61 + 0xf & uVar63;
        local_4d9 = uVar61 != 0;
        if (!local_4d9) {
          return local_4d9;
        }
        goto LAB_0108b6a7;
      }
      uVar66 = (int)uVar64 - 1;
      uVar67 = (ulong)uVar66;
      uVar62 = auStack_268[uVar67];
      fVar71 = afStack_178[uVar67 * 2];
      fVar95 = afStack_178[uVar67 * 2 + 1];
      register0x00001588 = 0;
      local_498 = (undefined1  [8])auStack_58[uVar67];
      uVar68 = 0;
      if (uVar62 != 0) {
        for (; (uVar62 >> uVar68 & 1) == 0; uVar68 = uVar68 + 1) {
        }
      }
      uVar62 = uVar62 - 1 & uVar62;
      auStack_268[uVar67] = uVar62;
      if (uVar62 == 0) {
        uVar64 = (ulong)uVar66;
      }
      auVar205._8_4_ = 0x3f800000;
      auVar205._0_8_ = &DAT_3f8000003f800000;
      auVar205._12_4_ = 0x3f800000;
      fVar147 = (float)(uVar68 + 1) * 0.14285715;
      fVar96 = (1.0 - (float)uVar68 * 0.14285715) * fVar71 + fVar95 * (float)uVar68 * 0.14285715;
      fVar71 = (1.0 - fVar147) * fVar71 + fVar95 * fVar147;
      fVar95 = fVar71 - fVar96;
      _local_428 = ZEXT432((uint)fVar96);
      auVar283 = ZEXT416((uint)fVar96);
      _local_408 = ZEXT416((uint)fVar71);
      auVar113 = ZEXT416((uint)fVar96);
      if (0.16666667 <= fVar95) break;
      auVar113 = vshufps_avx(_local_498,_local_498,0x50);
      auVar14 = vsubps_avx(auVar205,auVar113);
      fVar147 = auVar113._0_4_;
      fVar171 = auVar113._4_4_;
      fVar173 = auVar113._8_4_;
      fVar175 = auVar113._12_4_;
      fVar177 = auVar14._0_4_;
      fVar195 = auVar14._4_4_;
      fVar197 = auVar14._8_4_;
      fVar199 = auVar14._12_4_;
      auVar158._0_4_ = auVar256._0_4_ * fVar147 + fVar177 * (float)local_2f8._0_4_;
      auVar158._4_4_ = auVar256._4_4_ * fVar171 + fVar195 * (float)local_2f8._4_4_;
      auVar158._8_4_ = auVar256._0_4_ * fVar173 + fVar197 * fStack_2f0;
      auVar158._12_4_ = auVar256._4_4_ * fVar175 + fVar199 * fStack_2ec;
      auVar185._0_4_ = auVar268._0_4_ * fVar147 + fVar177 * (float)local_278._0_4_;
      auVar185._4_4_ = auVar268._4_4_ * fVar171 + fVar195 * (float)local_278._4_4_;
      auVar185._8_4_ = auVar268._0_4_ * fVar173 + fVar197 * fStack_270;
      auVar185._12_4_ = auVar268._4_4_ * fVar175 + fVar199 * fStack_26c;
      auVar206._0_4_ = auVar285._0_4_ * fVar147 + fVar177 * (float)local_308._0_4_;
      auVar206._4_4_ = auVar285._4_4_ * fVar171 + fVar195 * (float)local_308._4_4_;
      auVar206._8_4_ = auVar285._0_4_ * fVar173 + fVar197 * fStack_300;
      auVar206._12_4_ = auVar285._4_4_ * fVar175 + fVar199 * fStack_2fc;
      auVar109._0_4_ = (float)local_318._0_4_ * fVar147 + auVar240._0_4_ * fVar177;
      auVar109._4_4_ = (float)local_318._4_4_ * fVar171 + auVar240._4_4_ * fVar195;
      auVar109._8_4_ = fStack_310 * fVar173 + auVar240._0_4_ * fVar197;
      auVar109._12_4_ = fStack_30c * fVar175 + auVar240._4_4_ * fVar199;
      auVar144._16_16_ = auVar158;
      auVar144._0_16_ = auVar158;
      auVar168._16_16_ = auVar185;
      auVar168._0_16_ = auVar185;
      auVar194._16_16_ = auVar206;
      auVar194._0_16_ = auVar206;
      auVar91 = vshufps_avx(ZEXT2032(CONCAT416(fVar71,ZEXT416((uint)fVar96))),
                            ZEXT2032(CONCAT416(fVar71,ZEXT416((uint)fVar96))),0);
      auVar19 = vsubps_avx(auVar168,auVar144);
      fVar147 = auVar91._0_4_;
      fVar171 = auVar91._4_4_;
      fVar173 = auVar91._8_4_;
      fVar175 = auVar91._12_4_;
      fVar177 = auVar91._16_4_;
      fVar195 = auVar91._20_4_;
      fVar197 = auVar91._24_4_;
      auVar145._0_4_ = auVar158._0_4_ + auVar19._0_4_ * fVar147;
      auVar145._4_4_ = auVar158._4_4_ + auVar19._4_4_ * fVar171;
      auVar145._8_4_ = auVar158._8_4_ + auVar19._8_4_ * fVar173;
      auVar145._12_4_ = auVar158._12_4_ + auVar19._12_4_ * fVar175;
      auVar145._16_4_ = auVar158._0_4_ + auVar19._16_4_ * fVar177;
      auVar145._20_4_ = auVar158._4_4_ + auVar19._20_4_ * fVar195;
      auVar145._24_4_ = auVar158._8_4_ + auVar19._24_4_ * fVar197;
      auVar145._28_4_ = auVar158._12_4_ + auVar19._28_4_;
      auVar19 = vsubps_avx(auVar194,auVar168);
      auVar169._0_4_ = auVar185._0_4_ + auVar19._0_4_ * fVar147;
      auVar169._4_4_ = auVar185._4_4_ + auVar19._4_4_ * fVar171;
      auVar169._8_4_ = auVar185._8_4_ + auVar19._8_4_ * fVar173;
      auVar169._12_4_ = auVar185._12_4_ + auVar19._12_4_ * fVar175;
      auVar169._16_4_ = auVar185._0_4_ + auVar19._16_4_ * fVar177;
      auVar169._20_4_ = auVar185._4_4_ + auVar19._20_4_ * fVar195;
      auVar169._24_4_ = auVar185._8_4_ + auVar19._24_4_ * fVar197;
      auVar169._28_4_ = auVar185._12_4_ + auVar19._28_4_;
      auVar113 = vsubps_avx(auVar109,auVar206);
      auVar122._0_4_ = auVar206._0_4_ + auVar113._0_4_ * fVar147;
      auVar122._4_4_ = auVar206._4_4_ + auVar113._4_4_ * fVar171;
      auVar122._8_4_ = auVar206._8_4_ + auVar113._8_4_ * fVar173;
      auVar122._12_4_ = auVar206._12_4_ + auVar113._12_4_ * fVar175;
      auVar122._16_4_ = auVar206._0_4_ + auVar113._0_4_ * fVar177;
      auVar122._20_4_ = auVar206._4_4_ + auVar113._4_4_ * fVar195;
      auVar122._24_4_ = auVar206._8_4_ + auVar113._8_4_ * fVar197;
      auVar122._28_4_ = auVar206._12_4_ + auVar113._12_4_;
      auVar19 = vsubps_avx(auVar169,auVar145);
      auVar146._0_4_ = auVar145._0_4_ + fVar147 * auVar19._0_4_;
      auVar146._4_4_ = auVar145._4_4_ + fVar171 * auVar19._4_4_;
      auVar146._8_4_ = auVar145._8_4_ + fVar173 * auVar19._8_4_;
      auVar146._12_4_ = auVar145._12_4_ + fVar175 * auVar19._12_4_;
      auVar146._16_4_ = auVar145._16_4_ + fVar177 * auVar19._16_4_;
      auVar146._20_4_ = auVar145._20_4_ + fVar195 * auVar19._20_4_;
      auVar146._24_4_ = auVar145._24_4_ + fVar197 * auVar19._24_4_;
      auVar146._28_4_ = auVar145._28_4_ + auVar19._28_4_;
      auVar19 = vsubps_avx(auVar122,auVar169);
      auVar123._0_4_ = auVar169._0_4_ + fVar147 * auVar19._0_4_;
      auVar123._4_4_ = auVar169._4_4_ + fVar171 * auVar19._4_4_;
      auVar123._8_4_ = auVar169._8_4_ + fVar173 * auVar19._8_4_;
      auVar123._12_4_ = auVar169._12_4_ + fVar175 * auVar19._12_4_;
      auVar123._16_4_ = auVar169._16_4_ + fVar177 * auVar19._16_4_;
      auVar123._20_4_ = auVar169._20_4_ + fVar195 * auVar19._20_4_;
      auVar123._24_4_ = auVar169._24_4_ + fVar197 * auVar19._24_4_;
      auVar123._28_4_ = auVar169._28_4_ + auVar19._28_4_;
      auVar19 = vsubps_avx(auVar123,auVar146);
      auVar159._0_4_ = auVar146._0_4_ + fVar147 * auVar19._0_4_;
      auVar159._4_4_ = auVar146._4_4_ + fVar171 * auVar19._4_4_;
      auVar159._8_4_ = auVar146._8_4_ + fVar173 * auVar19._8_4_;
      auVar159._12_4_ = auVar146._12_4_ + fVar175 * auVar19._12_4_;
      auVar170._16_4_ = auVar146._16_4_ + fVar177 * auVar19._16_4_;
      auVar170._0_16_ = auVar159;
      auVar170._20_4_ = auVar146._20_4_ + fVar195 * auVar19._20_4_;
      auVar170._24_4_ = auVar146._24_4_ + fVar197 * auVar19._24_4_;
      auVar170._28_4_ = auVar146._28_4_ + auVar169._28_4_;
      fVar147 = auVar19._4_4_ * 3.0;
      auVar137 = auVar170._16_16_;
      auVar112 = vshufps_avx(ZEXT416((uint)(fVar95 * 0.33333334)),
                             ZEXT416((uint)(fVar95 * 0.33333334)),0);
      auVar269._0_4_ = auVar159._0_4_ + auVar112._0_4_ * auVar19._0_4_ * 3.0;
      auVar269._4_4_ = auVar159._4_4_ + auVar112._4_4_ * fVar147;
      auVar269._8_4_ = auVar159._8_4_ + auVar112._8_4_ * auVar19._8_4_ * 3.0;
      auVar269._12_4_ = auVar159._12_4_ + auVar112._12_4_ * auVar19._12_4_ * 3.0;
      auVar213 = vshufpd_avx(auVar159,auVar159,3);
      auVar133 = vshufpd_avx(auVar137,auVar137,3);
      _local_3a8 = auVar213;
      auVar20 = _local_3a8;
      auVar113 = vsubps_avx(auVar213,auVar159);
      _local_3e8 = auVar133;
      auVar14 = vsubps_avx(auVar133,auVar137);
      auVar110._0_4_ = auVar113._0_4_ + auVar14._0_4_;
      auVar110._4_4_ = auVar113._4_4_ + auVar14._4_4_;
      auVar110._8_4_ = auVar113._8_4_ + auVar14._8_4_;
      auVar110._12_4_ = auVar113._12_4_ + auVar14._12_4_;
      auVar113 = vmovshdup_avx(auVar159);
      auVar14 = vmovshdup_avx(auVar269);
      auVar163 = vshufps_avx(auVar110,auVar110,0);
      auVar88 = vshufps_avx(auVar110,auVar110,0x55);
      fVar195 = auVar88._0_4_;
      fVar197 = auVar88._4_4_;
      fVar199 = auVar88._8_4_;
      fVar201 = auVar88._12_4_;
      fVar171 = auVar163._0_4_;
      fVar173 = auVar163._4_4_;
      fVar175 = auVar163._8_4_;
      fVar177 = auVar163._12_4_;
      auVar257._0_4_ = fVar171 * auVar159._0_4_ + fVar195 * auVar113._0_4_;
      auVar257._4_4_ = fVar173 * auVar159._4_4_ + fVar197 * auVar113._4_4_;
      auVar257._8_4_ = fVar175 * auVar159._8_4_ + fVar199 * auVar113._8_4_;
      auVar257._12_4_ = fVar177 * auVar159._12_4_ + fVar201 * auVar113._12_4_;
      _local_448 = auVar269;
      auVar270._0_4_ = auVar269._0_4_ * fVar171 + fVar195 * auVar14._0_4_;
      auVar270._4_4_ = auVar269._4_4_ * fVar173 + fVar197 * auVar14._4_4_;
      auVar270._8_4_ = auVar269._8_4_ * fVar175 + fVar199 * auVar14._8_4_;
      auVar270._12_4_ = auVar269._12_4_ * fVar177 + fVar201 * auVar14._12_4_;
      auVar14 = vshufps_avx(auVar257,auVar257,0xe8);
      auVar163 = vshufps_avx(auVar270,auVar270,0xe8);
      auVar113 = vcmpps_avx(auVar14,auVar163,1);
      uVar62 = vextractps_avx(auVar113,0);
      auVar88 = auVar270;
      if ((uVar62 & 1) == 0) {
        auVar88 = auVar257;
      }
      auVar111._0_4_ = auVar112._0_4_ * auVar19._16_4_ * 3.0;
      auVar111._4_4_ = auVar112._4_4_ * fVar147;
      auVar111._8_4_ = auVar112._8_4_ * auVar19._24_4_ * 3.0;
      auVar111._12_4_ = auVar112._12_4_ * auVar91._28_4_;
      auVar16 = vsubps_avx(auVar137,auVar111);
      auVar112 = vmovshdup_avx(auVar16);
      auVar137 = vmovshdup_avx(auVar137);
      fVar147 = auVar16._0_4_;
      fVar215 = auVar16._4_4_;
      auVar335._0_4_ = fVar171 * fVar147 + fVar195 * auVar112._0_4_;
      auVar335._4_4_ = fVar173 * fVar215 + fVar197 * auVar112._4_4_;
      auVar335._8_4_ = fVar175 * auVar16._8_4_ + fVar199 * auVar112._8_4_;
      auVar335._12_4_ = fVar177 * auVar16._12_4_ + fVar201 * auVar112._12_4_;
      auVar319._0_4_ = fVar171 * auVar170._16_4_ + fVar195 * auVar137._0_4_;
      auVar319._4_4_ = fVar173 * auVar170._20_4_ + fVar197 * auVar137._4_4_;
      auVar319._8_4_ = fVar175 * auVar170._24_4_ + fVar199 * auVar137._8_4_;
      auVar319._12_4_ = fVar177 * auVar170._28_4_ + fVar201 * auVar137._12_4_;
      auVar137 = vshufps_avx(auVar335,auVar335,0xe8);
      auVar15 = vshufps_avx(auVar319,auVar319,0xe8);
      auVar112 = vcmpps_avx(auVar137,auVar15,1);
      uVar62 = vextractps_avx(auVar112,0);
      auVar72 = auVar319;
      if ((uVar62 & 1) == 0) {
        auVar72 = auVar335;
      }
      auVar88 = vmaxss_avx(auVar72,auVar88);
      auVar14 = vminps_avx(auVar14,auVar163);
      auVar163 = vminps_avx(auVar137,auVar15);
      auVar163 = vminps_avx(auVar14,auVar163);
      auVar113 = vshufps_avx(auVar113,auVar113,0x55);
      auVar113 = vblendps_avx(auVar113,auVar112,2);
      auVar112 = vpslld_avx(auVar113,0x1f);
      auVar113 = vshufpd_avx(auVar270,auVar270,1);
      auVar113 = vinsertps_avx(auVar113,auVar319,0x9c);
      auVar14 = vshufpd_avx(auVar257,auVar257,1);
      auVar14 = vinsertps_avx(auVar14,auVar335,0x9c);
      auVar113 = vblendvps_avx(auVar14,auVar113,auVar112);
      auVar14 = vmovshdup_avx(auVar113);
      auVar113 = vmaxss_avx(auVar14,auVar113);
      fVar175 = auVar163._0_4_;
      auVar14 = vmovshdup_avx(auVar163);
      fVar173 = auVar113._0_4_;
      fVar177 = auVar14._0_4_;
      fVar171 = auVar88._0_4_;
      _local_3a8 = auVar20;
      if ((0.0001 <= fVar175) || (fVar173 <= -0.0001)) {
        if ((-0.0001 < fVar171 && fVar177 < 0.0001) ||
           ((fVar175 < 0.0001 && -0.0001 < fVar171 || (fVar177 < 0.0001 && -0.0001 < fVar173))))
        goto LAB_0108ccf8;
LAB_0108d8f8:
        bVar53 = true;
      }
      else {
LAB_0108ccf8:
        auVar112 = vcmpps_avx(auVar163,ZEXT416(0) << 0x20,1);
        auVar14 = vcmpss_avx(auVar88,ZEXT416(0),1);
        auVar327._8_4_ = 0x3f800000;
        auVar327._0_8_ = &DAT_3f8000003f800000;
        auVar327._12_4_ = 0x3f800000;
        auVar207._8_4_ = 0xbf800000;
        auVar207._0_8_ = 0xbf800000bf800000;
        auVar207._12_4_ = 0xbf800000;
        auVar14 = vblendvps_avx(auVar327,auVar207,auVar14);
        auVar112 = vblendvps_avx(auVar327,auVar207,auVar112);
        auVar137 = vcmpss_avx(auVar14,auVar112,4);
        auVar137 = vpshufd_avx(ZEXT416(auVar137._0_4_ & 1),0x50);
        auVar137 = vpslld_avx(auVar137,0x1f);
        auVar137 = vpsrad_avx(auVar137,0x1f);
        auVar137 = vpandn_avx(auVar137,_DAT_02020eb0);
        auVar15 = vmovshdup_avx(auVar112);
        fVar195 = auVar15._0_4_;
        if ((auVar112._0_4_ != fVar195) || (NAN(auVar112._0_4_) || NAN(fVar195))) {
          if ((fVar177 != fVar175) || (NAN(fVar177) || NAN(fVar175))) {
            fVar175 = -fVar175 / (fVar177 - fVar175);
            auVar112 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar175) * 0.0 + fVar175)));
          }
          else {
            auVar112 = vcmpss_avx(auVar163,ZEXT416(0),0);
            auVar112 = vpshufd_avx(ZEXT416(auVar112._0_4_ & 1),0x50);
            auVar112 = vpslld_avx(auVar112,0x1f);
            auVar112 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar112);
          }
          auVar15 = vcmpps_avx(auVar137,auVar112,1);
          auVar163 = vblendps_avx(auVar137,auVar112,2);
          auVar112 = vblendps_avx(auVar112,auVar137,2);
          auVar137 = vblendvps_avx(auVar112,auVar163,auVar15);
        }
        auVar113 = vcmpss_avx(auVar113,ZEXT416(0),1);
        auVar138._8_4_ = 0xbf800000;
        auVar138._0_8_ = 0xbf800000bf800000;
        auVar138._12_4_ = 0xbf800000;
        auVar113 = vblendvps_avx(auVar327,auVar138,auVar113);
        fVar175 = auVar113._0_4_;
        if ((auVar14._0_4_ != fVar175) || (NAN(auVar14._0_4_) || NAN(fVar175))) {
          if ((fVar173 != fVar171) || (NAN(fVar173) || NAN(fVar171))) {
            fVar171 = -fVar171 / (fVar173 - fVar171);
            auVar113 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar171) * 0.0 + fVar171)));
          }
          else {
            auVar113 = vcmpss_avx(auVar88,ZEXT416(0),0);
            auVar113 = vpshufd_avx(ZEXT416(auVar113._0_4_ & 1),0x50);
            auVar113 = vpslld_avx(auVar113,0x1f);
            auVar113 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar113);
          }
          auVar112 = vcmpps_avx(auVar137,auVar113,1);
          auVar14 = vblendps_avx(auVar137,auVar113,2);
          auVar113 = vblendps_avx(auVar113,auVar137,2);
          auVar137 = vblendvps_avx(auVar113,auVar14,auVar112);
        }
        if ((fVar195 != fVar175) || (NAN(fVar195) || NAN(fVar175))) {
          auVar113 = vcmpps_avx(auVar137,auVar327,1);
          auVar14 = vinsertps_avx(auVar137,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar208._4_12_ = auVar137._4_12_;
          auVar208._0_4_ = 0x3f800000;
          auVar137 = vblendvps_avx(auVar208,auVar14,auVar113);
        }
        auVar113 = vcmpps_avx(auVar137,_DAT_01fec6f0,1);
        auVar54._12_4_ = 0;
        auVar54._0_12_ = auVar137._4_12_;
        auVar14 = vinsertps_avx(auVar137,ZEXT416(0x3f800000),0x10);
        auVar113 = vblendvps_avx(auVar14,auVar54 << 0x20,auVar113);
        auVar14 = vmovshdup_avx(auVar113);
        bVar53 = true;
        if (auVar113._0_4_ <= auVar14._0_4_) {
          auVar114._0_4_ = auVar113._0_4_ + -0.1;
          auVar114._4_4_ = auVar113._4_4_ + 0.1;
          auVar114._8_4_ = auVar113._8_4_ + 0.0;
          auVar114._12_4_ = auVar113._12_4_ + 0.0;
          auVar112 = vshufpd_avx(auVar269,auVar269,3);
          register0x000012c8 = 0x3f80000000000000;
          local_448 = (undefined1  [8])0x3f80000000000000;
          auVar113 = vcmpps_avx(auVar114,_local_448,1);
          auVar55._12_4_ = 0;
          auVar55._0_12_ = auVar114._4_12_;
          auVar14 = vinsertps_avx(auVar114,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar113 = vblendvps_avx(auVar14,auVar55 << 0x20,auVar113);
          auVar14 = vshufpd_avx(auVar16,auVar16,3);
          auVar163 = vshufps_avx(auVar113,auVar113,0x50);
          auVar88 = vsubps_avx(auVar327,auVar163);
          local_3a8._0_4_ = auVar213._0_4_;
          local_3a8._4_4_ = auVar213._4_4_;
          fStack_3a0 = auVar213._8_4_;
          fStack_39c = auVar213._12_4_;
          fVar171 = auVar163._0_4_;
          fVar173 = auVar163._4_4_;
          fVar175 = auVar163._8_4_;
          fVar177 = auVar163._12_4_;
          local_3e8._0_4_ = auVar133._0_4_;
          local_3e8._4_4_ = auVar133._4_4_;
          fStack_3e0 = auVar133._8_4_;
          fStack_3dc = auVar133._12_4_;
          fVar195 = auVar88._0_4_;
          fVar197 = auVar88._4_4_;
          fVar199 = auVar88._8_4_;
          fVar201 = auVar88._12_4_;
          auVar139._0_4_ = fVar171 * (float)local_3a8._0_4_ + fVar195 * auVar159._0_4_;
          auVar139._4_4_ = fVar173 * (float)local_3a8._4_4_ + fVar197 * auVar159._4_4_;
          auVar139._8_4_ = fVar175 * fStack_3a0 + fVar199 * auVar159._0_4_;
          auVar139._12_4_ = fVar177 * fStack_39c + fVar201 * auVar159._4_4_;
          auVar186._0_4_ = fVar171 * auVar112._0_4_ + fVar195 * auVar269._0_4_;
          auVar186._4_4_ = fVar173 * auVar112._4_4_ + fVar197 * auVar269._4_4_;
          auVar186._8_4_ = fVar175 * auVar112._8_4_ + fVar199 * auVar269._0_4_;
          auVar186._12_4_ = fVar177 * auVar112._12_4_ + fVar201 * auVar269._4_4_;
          auVar242._0_4_ = fVar171 * auVar14._0_4_ + fVar195 * fVar147;
          auVar242._4_4_ = fVar173 * auVar14._4_4_ + fVar197 * fVar215;
          auVar242._8_4_ = fVar175 * auVar14._8_4_ + fVar199 * fVar147;
          auVar242._12_4_ = fVar177 * auVar14._12_4_ + fVar201 * fVar215;
          auVar258._0_4_ = fVar171 * (float)local_3e8._0_4_ + fVar195 * auVar170._16_4_;
          auVar258._4_4_ = fVar173 * (float)local_3e8._4_4_ + fVar197 * auVar170._20_4_;
          auVar258._8_4_ = fVar175 * fStack_3e0 + fVar199 * auVar170._16_4_;
          auVar258._12_4_ = fVar177 * fStack_3dc + fVar201 * auVar170._20_4_;
          auVar133 = vsubps_avx(auVar327,auVar113);
          auVar14 = vmovshdup_avx(_local_498);
          auVar213 = vmovsldup_avx(_local_498);
          local_498._0_4_ = auVar133._0_4_ * auVar213._0_4_ + auVar14._0_4_ * auVar113._0_4_;
          local_498._4_4_ = auVar133._4_4_ * auVar213._4_4_ + auVar14._4_4_ * auVar113._4_4_;
          fStack_490 = auVar133._8_4_ * auVar213._8_4_ + auVar14._8_4_ * auVar113._8_4_;
          fStack_48c = auVar133._12_4_ * auVar213._12_4_ + auVar14._12_4_ * auVar113._12_4_;
          _local_3e8 = vmovshdup_avx(_local_498);
          auVar113 = vsubps_avx(auVar186,auVar139);
          auVar209._0_4_ = auVar113._0_4_ * 3.0;
          auVar209._4_4_ = auVar113._4_4_ * 3.0;
          auVar209._8_4_ = auVar113._8_4_ * 3.0;
          auVar209._12_4_ = auVar113._12_4_ * 3.0;
          auVar113 = vsubps_avx(auVar242,auVar186);
          auVar225._0_4_ = auVar113._0_4_ * 3.0;
          auVar225._4_4_ = auVar113._4_4_ * 3.0;
          auVar225._8_4_ = auVar113._8_4_ * 3.0;
          auVar225._12_4_ = auVar113._12_4_ * 3.0;
          auVar113 = vsubps_avx(auVar258,auVar242);
          auVar271._0_4_ = auVar113._0_4_ * 3.0;
          auVar271._4_4_ = auVar113._4_4_ * 3.0;
          auVar271._8_4_ = auVar113._8_4_ * 3.0;
          auVar271._12_4_ = auVar113._12_4_ * 3.0;
          auVar14 = vminps_avx(auVar225,auVar271);
          auVar113 = vmaxps_avx(auVar225,auVar271);
          auVar14 = vminps_avx(auVar209,auVar14);
          auVar113 = vmaxps_avx(auVar209,auVar113);
          auVar213 = vshufpd_avx(auVar14,auVar14,3);
          auVar133 = vshufpd_avx(auVar113,auVar113,3);
          auVar14 = vminps_avx(auVar14,auVar213);
          auVar113 = vmaxps_avx(auVar113,auVar133);
          auVar213 = vshufps_avx(ZEXT416((uint)(1.0 / fVar95)),ZEXT416((uint)(1.0 / fVar95)),0);
          auVar210._0_4_ = auVar213._0_4_ * auVar14._0_4_;
          auVar210._4_4_ = auVar213._4_4_ * auVar14._4_4_;
          auVar210._8_4_ = auVar213._8_4_ * auVar14._8_4_;
          auVar210._12_4_ = auVar213._12_4_ * auVar14._12_4_;
          auVar226._0_4_ = auVar113._0_4_ * auVar213._0_4_;
          auVar226._4_4_ = auVar113._4_4_ * auVar213._4_4_;
          auVar226._8_4_ = auVar113._8_4_ * auVar213._8_4_;
          auVar226._12_4_ = auVar113._12_4_ * auVar213._12_4_;
          auVar88 = ZEXT416((uint)(1.0 / (local_3e8._0_4_ - (float)local_498._0_4_)));
          auVar113 = vshufpd_avx(auVar139,auVar139,3);
          auVar14 = vshufpd_avx(auVar186,auVar186,3);
          auVar213 = vshufpd_avx(auVar242,auVar242,3);
          auVar133 = vshufpd_avx(auVar258,auVar258,3);
          auVar113 = vsubps_avx(auVar113,auVar139);
          auVar112 = vsubps_avx(auVar14,auVar186);
          auVar163 = vsubps_avx(auVar213,auVar242);
          auVar133 = vsubps_avx(auVar133,auVar258);
          auVar14 = vminps_avx(auVar113,auVar112);
          auVar113 = vmaxps_avx(auVar113,auVar112);
          auVar213 = vminps_avx(auVar163,auVar133);
          auVar213 = vminps_avx(auVar14,auVar213);
          auVar14 = vmaxps_avx(auVar163,auVar133);
          auVar113 = vmaxps_avx(auVar113,auVar14);
          auVar14 = vshufps_avx(auVar88,auVar88,0);
          auVar286._0_4_ = auVar14._0_4_ * auVar213._0_4_;
          auVar286._4_4_ = auVar14._4_4_ * auVar213._4_4_;
          auVar286._8_4_ = auVar14._8_4_ * auVar213._8_4_;
          auVar286._12_4_ = auVar14._12_4_ * auVar213._12_4_;
          auVar293._0_4_ = auVar14._0_4_ * auVar113._0_4_;
          auVar293._4_4_ = auVar14._4_4_ * auVar113._4_4_;
          auVar293._8_4_ = auVar14._8_4_ * auVar113._8_4_;
          auVar293._12_4_ = auVar14._12_4_ * auVar113._12_4_;
          auVar113 = vmovsldup_avx(_local_498);
          auVar243._4_12_ = auVar113._4_12_;
          auVar243._0_4_ = fVar96;
          auVar259._4_12_ = local_498._4_12_;
          auVar259._0_4_ = fVar71;
          auVar89._0_4_ = (fVar71 + fVar96) * 0.5;
          auVar89._4_4_ = ((float)local_498._4_4_ + auVar113._4_4_) * 0.5;
          auVar89._8_4_ = (fStack_490 + auVar113._8_4_) * 0.5;
          auVar89._12_4_ = (fStack_48c + auVar113._12_4_) * 0.5;
          auVar113 = vshufps_avx(auVar89,auVar89,0);
          fVar147 = auVar113._0_4_;
          fVar171 = auVar113._4_4_;
          fVar173 = auVar113._8_4_;
          fVar175 = auVar113._12_4_;
          local_488 = auVar253._0_4_;
          fStack_484 = auVar253._4_4_;
          fStack_480 = auVar253._8_4_;
          fStack_47c = auVar253._12_4_;
          auVar187._0_4_ = fVar147 * (float)local_1a8._0_4_ + local_488;
          auVar187._4_4_ = fVar171 * (float)local_1a8._4_4_ + fStack_484;
          auVar187._8_4_ = fVar173 * fStack_1a0 + fStack_480;
          auVar187._12_4_ = fVar175 * fStack_19c + fStack_47c;
          auVar272._0_4_ = fVar147 * (float)local_1b8._0_4_ + (float)local_3b8._0_4_;
          auVar272._4_4_ = fVar171 * (float)local_1b8._4_4_ + (float)local_3b8._4_4_;
          auVar272._8_4_ = fVar173 * fStack_1b0 + fStack_3b0;
          auVar272._12_4_ = fVar175 * fStack_1ac + fStack_3ac;
          auVar307._0_4_ = fVar147 * (float)local_1c8._0_4_ + (float)local_3c8._0_4_;
          auVar307._4_4_ = fVar171 * (float)local_1c8._4_4_ + (float)local_3c8._4_4_;
          auVar307._8_4_ = fVar173 * fStack_1c0 + fStack_3c0;
          auVar307._12_4_ = fVar175 * fStack_1bc + fStack_3bc;
          auVar113 = vsubps_avx(auVar272,auVar187);
          auVar188._0_4_ = auVar113._0_4_ * fVar147 + auVar187._0_4_;
          auVar188._4_4_ = auVar113._4_4_ * fVar171 + auVar187._4_4_;
          auVar188._8_4_ = auVar113._8_4_ * fVar173 + auVar187._8_4_;
          auVar188._12_4_ = auVar113._12_4_ * fVar175 + auVar187._12_4_;
          auVar113 = vsubps_avx(auVar307,auVar272);
          auVar273._0_4_ = auVar272._0_4_ + auVar113._0_4_ * fVar147;
          auVar273._4_4_ = auVar272._4_4_ + auVar113._4_4_ * fVar171;
          auVar273._8_4_ = auVar272._8_4_ + auVar113._8_4_ * fVar173;
          auVar273._12_4_ = auVar272._12_4_ + auVar113._12_4_ * fVar175;
          auVar113 = vsubps_avx(auVar273,auVar188);
          fVar147 = auVar188._0_4_ + auVar113._0_4_ * fVar147;
          fVar171 = auVar188._4_4_ + auVar113._4_4_ * fVar171;
          auVar140._0_8_ = CONCAT44(fVar171,fVar147);
          auVar140._8_4_ = auVar188._8_4_ + auVar113._8_4_ * fVar173;
          auVar140._12_4_ = auVar188._12_4_ + auVar113._12_4_ * fVar175;
          fVar173 = auVar113._0_4_ * 3.0;
          fVar175 = auVar113._4_4_ * 3.0;
          auVar189._0_8_ = CONCAT44(fVar175,fVar173);
          auVar189._8_4_ = auVar113._8_4_ * 3.0;
          auVar189._12_4_ = auVar113._12_4_ * 3.0;
          auVar274._8_8_ = auVar140._0_8_;
          auVar274._0_8_ = auVar140._0_8_;
          auVar113 = vshufpd_avx(auVar140,auVar140,3);
          auVar14 = vshufps_avx(auVar89,auVar89,0x55);
          auVar163 = vsubps_avx(auVar113,auVar274);
          auVar275._0_4_ = auVar14._0_4_ * auVar163._0_4_ + fVar147;
          auVar275._4_4_ = auVar14._4_4_ * auVar163._4_4_ + fVar171;
          auVar275._8_4_ = auVar14._8_4_ * auVar163._8_4_ + fVar147;
          auVar275._12_4_ = auVar14._12_4_ * auVar163._12_4_ + fVar171;
          auVar320._8_8_ = auVar189._0_8_;
          auVar320._0_8_ = auVar189._0_8_;
          auVar113 = vshufpd_avx(auVar189,auVar189,1);
          auVar113 = vsubps_avx(auVar113,auVar320);
          auVar190._0_4_ = fVar173 + auVar14._0_4_ * auVar113._0_4_;
          auVar190._4_4_ = fVar175 + auVar14._4_4_ * auVar113._4_4_;
          auVar190._8_4_ = fVar173 + auVar14._8_4_ * auVar113._8_4_;
          auVar190._12_4_ = fVar175 + auVar14._12_4_ * auVar113._12_4_;
          auVar14 = vmovshdup_avx(auVar190);
          auVar321._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
          auVar321._8_4_ = auVar14._8_4_ ^ 0x80000000;
          auVar321._12_4_ = auVar14._12_4_ ^ 0x80000000;
          auVar213 = vmovshdup_avx(auVar163);
          auVar113 = vunpcklps_avx(auVar213,auVar321);
          auVar133 = vshufps_avx(auVar113,auVar321,4);
          auVar141._0_8_ = auVar163._0_8_ ^ 0x8000000080000000;
          auVar141._8_4_ = -auVar163._8_4_;
          auVar141._12_4_ = -auVar163._12_4_;
          auVar113 = vmovlhps_avx(auVar141,auVar190);
          auVar112 = vshufps_avx(auVar113,auVar190,8);
          auVar113 = ZEXT416((uint)(auVar213._0_4_ * auVar190._0_4_ - auVar14._0_4_ * auVar163._0_4_
                                   ));
          auVar14 = vshufps_avx(auVar113,auVar113,0);
          auVar113 = vdivps_avx(auVar133,auVar14);
          auVar14 = vdivps_avx(auVar112,auVar14);
          auVar112 = vinsertps_avx(auVar210,auVar286,0x1c);
          auVar163 = vinsertps_avx(auVar226,auVar293,0x1c);
          auVar88 = vinsertps_avx(auVar286,auVar210,0x4c);
          auVar137 = vinsertps_avx(auVar293,auVar226,0x4c);
          auVar213 = vmovsldup_avx(auVar113);
          auVar294._0_4_ = auVar213._0_4_ * auVar112._0_4_;
          auVar294._4_4_ = auVar213._4_4_ * auVar112._4_4_;
          auVar294._8_4_ = auVar213._8_4_ * auVar112._8_4_;
          auVar294._12_4_ = auVar213._12_4_ * auVar112._12_4_;
          auVar287._0_4_ = auVar213._0_4_ * auVar163._0_4_;
          auVar287._4_4_ = auVar213._4_4_ * auVar163._4_4_;
          auVar287._8_4_ = auVar213._8_4_ * auVar163._8_4_;
          auVar287._12_4_ = auVar213._12_4_ * auVar163._12_4_;
          auVar133 = vminps_avx(auVar294,auVar287);
          auVar213 = vmaxps_avx(auVar287,auVar294);
          auVar15 = vmovsldup_avx(auVar14);
          auVar336._0_4_ = auVar15._0_4_ * auVar88._0_4_;
          auVar336._4_4_ = auVar15._4_4_ * auVar88._4_4_;
          auVar336._8_4_ = auVar15._8_4_ * auVar88._8_4_;
          auVar336._12_4_ = auVar15._12_4_ * auVar88._12_4_;
          auVar288._0_4_ = auVar15._0_4_ * auVar137._0_4_;
          auVar288._4_4_ = auVar15._4_4_ * auVar137._4_4_;
          auVar288._8_4_ = auVar15._8_4_ * auVar137._8_4_;
          auVar288._12_4_ = auVar15._12_4_ * auVar137._12_4_;
          auVar15 = vminps_avx(auVar336,auVar288);
          auVar115._0_4_ = auVar133._0_4_ + auVar15._0_4_;
          auVar115._4_4_ = auVar133._4_4_ + auVar15._4_4_;
          auVar115._8_4_ = auVar133._8_4_ + auVar15._8_4_;
          auVar115._12_4_ = auVar133._12_4_ + auVar15._12_4_;
          auVar133 = vmaxps_avx(auVar288,auVar336);
          auVar15 = vsubps_avx(auVar243,auVar89);
          auVar16 = vsubps_avx(auVar259,auVar89);
          auVar260._0_4_ = auVar213._0_4_ + auVar133._0_4_;
          auVar260._4_4_ = auVar213._4_4_ + auVar133._4_4_;
          auVar260._8_4_ = auVar213._8_4_ + auVar133._8_4_;
          auVar260._12_4_ = auVar213._12_4_ + auVar133._12_4_;
          auVar295._8_8_ = 0x3f800000;
          auVar295._0_8_ = 0x3f800000;
          auVar213 = vsubps_avx(auVar295,auVar260);
          auVar133 = vsubps_avx(auVar295,auVar115);
          fVar197 = auVar15._0_4_;
          auVar296._0_4_ = fVar197 * auVar213._0_4_;
          fVar199 = auVar15._4_4_;
          auVar296._4_4_ = fVar199 * auVar213._4_4_;
          fVar201 = auVar15._8_4_;
          auVar296._8_4_ = fVar201 * auVar213._8_4_;
          fVar215 = auVar15._12_4_;
          auVar296._12_4_ = fVar215 * auVar213._12_4_;
          fVar173 = auVar16._0_4_;
          auVar261._0_4_ = auVar213._0_4_ * fVar173;
          fVar175 = auVar16._4_4_;
          auVar261._4_4_ = auVar213._4_4_ * fVar175;
          fVar177 = auVar16._8_4_;
          auVar261._8_4_ = auVar213._8_4_ * fVar177;
          fVar195 = auVar16._12_4_;
          auVar261._12_4_ = auVar213._12_4_ * fVar195;
          auVar328._0_4_ = fVar197 * auVar133._0_4_;
          auVar328._4_4_ = fVar199 * auVar133._4_4_;
          auVar328._8_4_ = fVar201 * auVar133._8_4_;
          auVar328._12_4_ = fVar215 * auVar133._12_4_;
          auVar116._0_4_ = fVar173 * auVar133._0_4_;
          auVar116._4_4_ = fVar175 * auVar133._4_4_;
          auVar116._8_4_ = fVar177 * auVar133._8_4_;
          auVar116._12_4_ = fVar195 * auVar133._12_4_;
          auVar213 = vminps_avx(auVar296,auVar328);
          auVar133 = vminps_avx(auVar261,auVar116);
          auVar15 = vminps_avx(auVar213,auVar133);
          auVar213 = vmaxps_avx(auVar328,auVar296);
          auVar133 = vmaxps_avx(auVar116,auVar261);
          auVar16 = vshufps_avx(auVar89,auVar89,0x54);
          auVar133 = vmaxps_avx(auVar133,auVar213);
          auVar72 = vshufps_avx(auVar275,auVar275,0);
          auVar73 = vshufps_avx(auVar275,auVar275,0x55);
          auVar213 = vhaddps_avx(auVar15,auVar15);
          auVar133 = vhaddps_avx(auVar133,auVar133);
          auVar262._0_4_ = auVar72._0_4_ * auVar113._0_4_ + auVar73._0_4_ * auVar14._0_4_;
          auVar262._4_4_ = auVar72._4_4_ * auVar113._4_4_ + auVar73._4_4_ * auVar14._4_4_;
          auVar262._8_4_ = auVar72._8_4_ * auVar113._8_4_ + auVar73._8_4_ * auVar14._8_4_;
          auVar262._12_4_ = auVar72._12_4_ * auVar113._12_4_ + auVar73._12_4_ * auVar14._12_4_;
          auVar15 = vsubps_avx(auVar16,auVar262);
          fVar147 = auVar15._0_4_ + auVar213._0_4_;
          fVar171 = auVar15._0_4_ + auVar133._0_4_;
          auVar213 = vmaxss_avx(ZEXT416((uint)fVar96),ZEXT416((uint)fVar147));
          auVar133 = vminss_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar71));
          if (auVar213._0_4_ <= auVar133._0_4_) {
            auVar213 = vmovshdup_avx(auVar113);
            auVar160._0_4_ = auVar112._0_4_ * auVar213._0_4_;
            auVar160._4_4_ = auVar112._4_4_ * auVar213._4_4_;
            auVar160._8_4_ = auVar112._8_4_ * auVar213._8_4_;
            auVar160._12_4_ = auVar112._12_4_ * auVar213._12_4_;
            auVar117._0_4_ = auVar163._0_4_ * auVar213._0_4_;
            auVar117._4_4_ = auVar163._4_4_ * auVar213._4_4_;
            auVar117._8_4_ = auVar163._8_4_ * auVar213._8_4_;
            auVar117._12_4_ = auVar163._12_4_ * auVar213._12_4_;
            auVar133 = vminps_avx(auVar160,auVar117);
            auVar213 = vmaxps_avx(auVar117,auVar160);
            auVar112 = vmovshdup_avx(auVar14);
            auVar211._0_4_ = auVar112._0_4_ * auVar88._0_4_;
            auVar211._4_4_ = auVar112._4_4_ * auVar88._4_4_;
            auVar211._8_4_ = auVar112._8_4_ * auVar88._8_4_;
            auVar211._12_4_ = auVar112._12_4_ * auVar88._12_4_;
            auVar161._0_4_ = auVar112._0_4_ * auVar137._0_4_;
            auVar161._4_4_ = auVar112._4_4_ * auVar137._4_4_;
            auVar161._8_4_ = auVar112._8_4_ * auVar137._8_4_;
            auVar161._12_4_ = auVar112._12_4_ * auVar137._12_4_;
            auVar112 = vminps_avx(auVar211,auVar161);
            auVar227._0_4_ = auVar133._0_4_ + auVar112._0_4_;
            auVar227._4_4_ = auVar133._4_4_ + auVar112._4_4_;
            auVar227._8_4_ = auVar133._8_4_ + auVar112._8_4_;
            auVar227._12_4_ = auVar133._12_4_ + auVar112._12_4_;
            auVar133 = vmaxps_avx(auVar161,auVar211);
            auVar118._0_4_ = auVar213._0_4_ + auVar133._0_4_;
            auVar118._4_4_ = auVar213._4_4_ + auVar133._4_4_;
            auVar118._8_4_ = auVar213._8_4_ + auVar133._8_4_;
            auVar118._12_4_ = auVar213._12_4_ + auVar133._12_4_;
            auVar213 = vsubps_avx(_local_448,auVar118);
            auVar133 = vsubps_avx(_local_448,auVar227);
            auVar212._0_4_ = fVar197 * auVar213._0_4_;
            auVar212._4_4_ = fVar199 * auVar213._4_4_;
            auVar212._8_4_ = fVar201 * auVar213._8_4_;
            auVar212._12_4_ = fVar215 * auVar213._12_4_;
            auVar228._0_4_ = fVar197 * auVar133._0_4_;
            auVar228._4_4_ = fVar199 * auVar133._4_4_;
            auVar228._8_4_ = fVar201 * auVar133._8_4_;
            auVar228._12_4_ = fVar215 * auVar133._12_4_;
            auVar119._0_4_ = fVar173 * auVar213._0_4_;
            auVar119._4_4_ = fVar175 * auVar213._4_4_;
            auVar119._8_4_ = fVar177 * auVar213._8_4_;
            auVar119._12_4_ = fVar195 * auVar213._12_4_;
            auVar162._0_4_ = fVar173 * auVar133._0_4_;
            auVar162._4_4_ = fVar175 * auVar133._4_4_;
            auVar162._8_4_ = fVar177 * auVar133._8_4_;
            auVar162._12_4_ = fVar195 * auVar133._12_4_;
            auVar213 = vminps_avx(auVar212,auVar228);
            auVar133 = vminps_avx(auVar119,auVar162);
            auVar213 = vminps_avx(auVar213,auVar133);
            auVar133 = vmaxps_avx(auVar228,auVar212);
            auVar112 = vmaxps_avx(auVar162,auVar119);
            auVar213 = vhaddps_avx(auVar213,auVar213);
            auVar133 = vmaxps_avx(auVar112,auVar133);
            auVar133 = vhaddps_avx(auVar133,auVar133);
            auVar112 = vmovshdup_avx(auVar15);
            auVar163 = ZEXT416((uint)(auVar112._0_4_ + auVar213._0_4_));
            auVar213 = vmaxss_avx(_local_498,auVar163);
            auVar112 = ZEXT416((uint)(auVar112._0_4_ + auVar133._0_4_));
            auVar133 = vminss_avx(auVar112,_local_3e8);
            auVar329._8_4_ = 0x7fffffff;
            auVar329._0_8_ = 0x7fffffff7fffffff;
            auVar329._12_4_ = 0x7fffffff;
            if (auVar213._0_4_ <= auVar133._0_4_) {
              uVar62 = 0;
              if ((fVar96 < fVar147) && (fVar171 < fVar71)) {
                auVar213 = vcmpps_avx(auVar112,_local_3e8,1);
                auVar133 = vcmpps_avx(_local_498,auVar163,1);
                auVar213 = vandps_avx(auVar133,auVar213);
                uVar62 = auVar213._0_4_;
              }
              if (((uint)uVar64 < 4 && 0.001 <= fVar95) && (uVar62 & 1) == 0) {
                bVar53 = false;
              }
              else {
                lVar65 = 200;
                do {
                  fVar95 = auVar15._0_4_;
                  fVar71 = 1.0 - fVar95;
                  auVar213 = ZEXT416((uint)(fVar71 * fVar71 * fVar71));
                  auVar213 = vshufps_avx(auVar213,auVar213,0);
                  auVar133 = ZEXT416((uint)(fVar95 * 3.0 * fVar71 * fVar71));
                  auVar133 = vshufps_avx(auVar133,auVar133,0);
                  auVar112 = ZEXT416((uint)(fVar71 * fVar95 * fVar95 * 3.0));
                  auVar112 = vshufps_avx(auVar112,auVar112,0);
                  auVar163 = ZEXT416((uint)(fVar95 * fVar95 * fVar95));
                  auVar163 = vshufps_avx(auVar163,auVar163,0);
                  fVar71 = local_488 * auVar213._0_4_ +
                           (float)local_3b8._0_4_ * auVar133._0_4_ +
                           (float)local_288._0_4_ * auVar163._0_4_ +
                           (float)local_3c8._0_4_ * auVar112._0_4_;
                  fVar95 = fStack_484 * auVar213._4_4_ +
                           (float)local_3b8._4_4_ * auVar133._4_4_ +
                           (float)local_288._4_4_ * auVar163._4_4_ +
                           (float)local_3c8._4_4_ * auVar112._4_4_;
                  auVar120._0_8_ = CONCAT44(fVar95,fVar71);
                  auVar120._8_4_ =
                       fStack_480 * auVar213._8_4_ +
                       fStack_3b0 * auVar133._8_4_ +
                       fStack_280 * auVar163._8_4_ + fStack_3c0 * auVar112._8_4_;
                  auVar120._12_4_ =
                       fStack_47c * auVar213._12_4_ +
                       fStack_3ac * auVar133._12_4_ +
                       fStack_27c * auVar163._12_4_ + fStack_3bc * auVar112._12_4_;
                  auVar164._8_8_ = auVar120._0_8_;
                  auVar164._0_8_ = auVar120._0_8_;
                  auVar133 = vshufpd_avx(auVar120,auVar120,1);
                  auVar213 = vmovshdup_avx(auVar15);
                  auVar133 = vsubps_avx(auVar133,auVar164);
                  auVar121._0_4_ = auVar213._0_4_ * auVar133._0_4_ + fVar71;
                  auVar121._4_4_ = auVar213._4_4_ * auVar133._4_4_ + fVar95;
                  auVar121._8_4_ = auVar213._8_4_ * auVar133._8_4_ + fVar71;
                  auVar121._12_4_ = auVar213._12_4_ * auVar133._12_4_ + fVar95;
                  auVar213 = vshufps_avx(auVar121,auVar121,0);
                  auVar133 = vshufps_avx(auVar121,auVar121,0x55);
                  auVar165._0_4_ = auVar113._0_4_ * auVar213._0_4_ + auVar14._0_4_ * auVar133._0_4_;
                  auVar165._4_4_ = auVar113._4_4_ * auVar213._4_4_ + auVar14._4_4_ * auVar133._4_4_;
                  auVar165._8_4_ = auVar113._8_4_ * auVar213._8_4_ + auVar14._8_4_ * auVar133._8_4_;
                  auVar165._12_4_ =
                       auVar113._12_4_ * auVar213._12_4_ + auVar14._12_4_ * auVar133._12_4_;
                  auVar15 = vsubps_avx(auVar15,auVar165);
                  auVar213 = vandps_avx(auVar329,auVar121);
                  auVar133 = vshufps_avx(auVar213,auVar213,0xf5);
                  auVar213 = vmaxss_avx(auVar133,auVar213);
                  if (auVar213._0_4_ < fVar97) {
                    fVar71 = auVar15._0_4_;
                    if ((0.0 <= fVar71) && (fVar71 <= 1.0)) {
                      auVar113 = vmovshdup_avx(auVar15);
                      fVar95 = auVar113._0_4_;
                      if ((0.0 <= fVar95) && (fVar95 <= 1.0)) {
                        auVar113 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                                 ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                                 0x1c);
                        auVar137 = vinsertps_avx(auVar113,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                        m128[2]),0x28);
                        aVar6 = (ray->org).field_0;
                        auVar113 = vsubps_avx(_local_328,(undefined1  [16])aVar6);
                        auVar113 = vdpps_avx(auVar113,auVar137,0x7f);
                        auVar14 = vsubps_avx(_local_338,(undefined1  [16])aVar6);
                        auVar14 = vdpps_avx(auVar14,auVar137,0x7f);
                        auVar213 = vsubps_avx(_local_348,(undefined1  [16])aVar6);
                        auVar213 = vdpps_avx(auVar213,auVar137,0x7f);
                        auVar58._4_4_ = fStack_384;
                        auVar58._0_4_ = local_388;
                        auVar58._8_4_ = fStack_380;
                        auVar58._12_4_ = fStack_37c;
                        auVar133 = vsubps_avx(auVar58,(undefined1  [16])aVar6);
                        auVar133 = vdpps_avx(auVar133,auVar137,0x7f);
                        auVar112 = vsubps_avx(_local_358,(undefined1  [16])aVar6);
                        auVar112 = vdpps_avx(auVar112,auVar137,0x7f);
                        auVar163 = vsubps_avx(_local_368,(undefined1  [16])aVar6);
                        auVar163 = vdpps_avx(auVar163,auVar137,0x7f);
                        auVar88 = vsubps_avx(_local_378,(undefined1  [16])aVar6);
                        auVar88 = vdpps_avx(auVar88,auVar137,0x7f);
                        auVar16 = vsubps_avx(_local_298,(undefined1  [16])aVar6);
                        auVar137 = vdpps_avx(auVar16,auVar137,0x7f);
                        fVar177 = 1.0 - fVar95;
                        fVar195 = 1.0 - fVar71;
                        fVar147 = auVar15._4_4_;
                        fVar171 = auVar15._8_4_;
                        fVar173 = auVar15._12_4_;
                        fVar175 = fVar195 * fVar71 * fVar71 * 3.0;
                        auVar214._0_4_ = fVar71 * fVar71 * fVar71;
                        auVar214._4_4_ = fVar147 * fVar147 * fVar147;
                        auVar214._8_4_ = fVar171 * fVar171 * fVar171;
                        auVar214._12_4_ = fVar173 * fVar173 * fVar173;
                        fVar147 = fVar71 * 3.0 * fVar195 * fVar195;
                        fVar171 = fVar195 * fVar195 * fVar195;
                        fVar71 = (fVar177 * auVar113._0_4_ + auVar112._0_4_ * fVar95) * fVar171 +
                                 fVar147 * (auVar163._0_4_ * fVar95 + fVar177 * auVar14._0_4_) +
                                 fVar175 * (auVar88._0_4_ * fVar95 + fVar177 * auVar213._0_4_) +
                                 auVar214._0_4_ *
                                 (fVar177 * auVar133._0_4_ + fVar95 * auVar137._0_4_);
                        if (((ray->org).field_0.m128[3] <= fVar71) &&
                           (fVar95 = ray->tfar, fVar71 <= fVar95)) {
                          local_3e8 = auVar70;
                          pGVar8 = (context->scene->geometries).items[uVar63].ptr;
                          auVar113 = ZEXT416((uint)fVar96);
                          if ((pGVar8->mask & ray->mask) == 0) {
                            bVar60 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar60 = true,
                                  pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar113 = vshufps_avx(auVar15,auVar15,0x55);
                            auVar263._8_4_ = 0x3f800000;
                            auVar263._0_8_ = &DAT_3f8000003f800000;
                            auVar263._12_4_ = 0x3f800000;
                            auVar283 = vsubps_avx(auVar263,auVar113);
                            fVar96 = auVar113._0_4_;
                            fVar173 = auVar113._4_4_;
                            fVar177 = auVar113._8_4_;
                            fVar197 = auVar113._12_4_;
                            fVar199 = auVar283._0_4_;
                            fVar201 = auVar283._4_4_;
                            fVar215 = auVar283._8_4_;
                            fVar216 = auVar283._12_4_;
                            auVar276._0_4_ =
                                 fVar96 * (float)local_358._0_4_ + fVar199 * (float)local_328._0_4_;
                            auVar276._4_4_ =
                                 fVar173 * (float)local_358._4_4_ + fVar201 * (float)local_328._4_4_
                            ;
                            auVar276._8_4_ = fVar177 * fStack_350 + fVar215 * fStack_320;
                            auVar276._12_4_ = fVar197 * fStack_34c + fVar216 * fStack_31c;
                            auVar289._0_4_ =
                                 fVar96 * (float)local_368._0_4_ + fVar199 * (float)local_338._0_4_;
                            auVar289._4_4_ =
                                 fVar173 * (float)local_368._4_4_ + fVar201 * (float)local_338._4_4_
                            ;
                            auVar289._8_4_ = fVar177 * fStack_360 + fVar215 * fStack_330;
                            auVar289._12_4_ = fVar197 * fStack_35c + fVar216 * fStack_32c;
                            auVar297._0_4_ =
                                 fVar96 * (float)local_378._0_4_ + fVar199 * (float)local_348._0_4_;
                            auVar297._4_4_ =
                                 fVar173 * (float)local_378._4_4_ + fVar201 * (float)local_348._4_4_
                            ;
                            auVar297._8_4_ = fVar177 * fStack_370 + fVar215 * fStack_340;
                            auVar297._12_4_ = fVar197 * fStack_36c + fVar216 * fStack_33c;
                            auVar244._0_4_ = fVar199 * local_388 + fVar96 * (float)local_298._0_4_;
                            auVar244._4_4_ = fVar201 * fStack_384 + fVar173 * (float)local_298._4_4_
                            ;
                            auVar244._8_4_ = fVar215 * fStack_380 + fVar177 * fStack_290;
                            auVar244._12_4_ = fVar216 * fStack_37c + fVar197 * fStack_28c;
                            auVar213 = vsubps_avx(auVar289,auVar276);
                            auVar133 = vsubps_avx(auVar297,auVar289);
                            auVar112 = vsubps_avx(auVar244,auVar297);
                            auVar113 = vshufps_avx(auVar15,auVar15,0);
                            fVar197 = auVar113._0_4_;
                            fVar199 = auVar113._4_4_;
                            fVar201 = auVar113._8_4_;
                            fVar215 = auVar113._12_4_;
                            auVar113 = vshufps_avx(ZEXT416((uint)fVar195),ZEXT416((uint)fVar195),0);
                            fVar96 = auVar113._0_4_;
                            fVar173 = auVar113._4_4_;
                            fVar177 = auVar113._8_4_;
                            fVar195 = auVar113._12_4_;
                            auVar113 = vshufps_avx(auVar214,auVar214,0);
                            auVar283 = vshufps_avx(ZEXT416((uint)fVar175),ZEXT416((uint)fVar175),0);
                            auVar14 = vshufps_avx(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),0);
                            auVar191._0_4_ =
                                 ((auVar213._0_4_ * fVar96 + fVar197 * auVar133._0_4_) * fVar96 +
                                 fVar197 * (auVar133._0_4_ * fVar96 + fVar197 * auVar112._0_4_)) *
                                 3.0;
                            auVar191._4_4_ =
                                 ((auVar213._4_4_ * fVar173 + fVar199 * auVar133._4_4_) * fVar173 +
                                 fVar199 * (auVar133._4_4_ * fVar173 + fVar199 * auVar112._4_4_)) *
                                 3.0;
                            auVar191._8_4_ =
                                 ((auVar213._8_4_ * fVar177 + fVar201 * auVar133._8_4_) * fVar177 +
                                 fVar201 * (auVar133._8_4_ * fVar177 + fVar201 * auVar112._8_4_)) *
                                 3.0;
                            auVar191._12_4_ =
                                 ((auVar213._12_4_ * fVar195 + fVar215 * auVar133._12_4_) * fVar195
                                 + fVar215 * (auVar133._12_4_ * fVar195 + fVar215 * auVar112._12_4_)
                                 ) * 3.0;
                            auVar213 = vshufps_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar171),0);
                            auVar142._0_4_ =
                                 auVar213._0_4_ * (float)local_1f8._0_4_ +
                                 auVar14._0_4_ * (float)local_208._0_4_ +
                                 auVar113._0_4_ * (float)local_228._0_4_ +
                                 auVar283._0_4_ * (float)local_218._0_4_;
                            auVar142._4_4_ =
                                 auVar213._4_4_ * (float)local_1f8._4_4_ +
                                 auVar14._4_4_ * (float)local_208._4_4_ +
                                 auVar113._4_4_ * (float)local_228._4_4_ +
                                 auVar283._4_4_ * (float)local_218._4_4_;
                            auVar142._8_4_ =
                                 auVar213._8_4_ * fStack_1f0 +
                                 auVar14._8_4_ * fStack_200 +
                                 auVar113._8_4_ * fStack_220 + auVar283._8_4_ * fStack_210;
                            auVar142._12_4_ =
                                 auVar213._12_4_ * fStack_1ec +
                                 auVar14._12_4_ * fStack_1fc +
                                 auVar113._12_4_ * fStack_21c + auVar283._12_4_ * fStack_20c;
                            auVar113 = vshufps_avx(auVar191,auVar191,0xc9);
                            auVar166._0_4_ = auVar142._0_4_ * auVar113._0_4_;
                            auVar166._4_4_ = auVar142._4_4_ * auVar113._4_4_;
                            auVar166._8_4_ = auVar142._8_4_ * auVar113._8_4_;
                            auVar166._12_4_ = auVar142._12_4_ * auVar113._12_4_;
                            auVar113 = vshufps_avx(auVar142,auVar142,0xc9);
                            auVar143._0_4_ = auVar191._0_4_ * auVar113._0_4_;
                            auVar143._4_4_ = auVar191._4_4_ * auVar113._4_4_;
                            auVar143._8_4_ = auVar191._8_4_ * auVar113._8_4_;
                            auVar143._12_4_ = auVar191._12_4_ * auVar113._12_4_;
                            auVar283 = vsubps_avx(auVar143,auVar166);
                            auVar113 = vshufps_avx(auVar283,auVar283,0xe9);
                            local_258 = vmovlps_avx(auVar113);
                            local_250 = auVar283._0_4_;
                            local_24c = vmovlps_avx(auVar15);
                            local_244 = (int)local_2e0;
                            local_240 = uVar63;
                            local_23c = context->user->instID[0];
                            local_238 = context->user->instPrimID[0];
                            ray->tfar = fVar71;
                            local_44c = -1;
                            local_2c8.valid = &local_44c;
                            local_2c8.geometryUserPtr = pGVar8->userPtr;
                            local_2c8.context = context->user;
                            local_2c8.hit = (RTCHitN *)&local_258;
                            local_2c8.N = 1;
                            stack0xfffffffffffffc5c = auVar20._4_28_;
                            local_3a8._0_4_ = fVar95;
                            local_2c8.ray = (RTCRayN *)ray;
                            if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0108d842:
                              p_Var13 = context->args->filter;
                              if (p_Var13 != (RTCFilterFunctionN)0x0) {
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                                  (*p_Var13)(&local_2c8);
                                  fVar95 = (float)local_3a8._0_4_;
                                }
                                if (*local_2c8.valid == 0) {
                                  bVar60 = false;
                                  goto LAB_0108d928;
                                }
                              }
                              bVar60 = true;
                            }
                            else {
                              (*pGVar8->occlusionFilterN)(&local_2c8);
                              fVar95 = (float)local_3a8._0_4_;
                              if (*local_2c8.valid != 0) goto LAB_0108d842;
                              bVar60 = false;
                            }
LAB_0108d928:
                            auVar113 = _local_428;
                            if (!bVar60) {
                              ray->tfar = fVar95;
                            }
                          }
                          _local_428 = auVar113;
                          bVar59 = (bool)(bVar59 | bVar60);
                          pre = local_2d8;
                          auVar70 = local_3e8;
                          auVar283 = _local_428;
                        }
                      }
                    }
                    break;
                  }
                  lVar65 = lVar65 + -1;
                } while (lVar65 != 0);
              }
              goto LAB_0108d5bf;
            }
          }
          goto LAB_0108d8f8;
        }
      }
LAB_0108d5bf:
      _local_428 = auVar283;
      auVar113 = _local_428;
    } while (bVar53);
    _local_428 = auVar113;
    local_1d8 = vinsertps_avx(_local_428,ZEXT416((uint)local_408._0_4_),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }